

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_modinv32_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  int64_t *piVar1;
  uint *puVar2;
  ulong *puVar3;
  ushort *puVar4;
  secp256k1_scalar *a;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int64_t iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar16;
  uint64_t uVar17;
  long lVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  secp256k1_modinv64_modinfo *m_00;
  long lVar24;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar25;
  secp256k1_modinv32_signed30 *b_00;
  long *extraout_RDX_01;
  uint uVar26;
  uint16_t *puVar27;
  long lVar28;
  code *pcVar29;
  secp256k1_modinv64_modinfo *psVar30;
  int *piVar31;
  secp256k1_modinv32_signed30 *psVar32;
  secp256k1_fe *psVar33;
  uint uVar34;
  uint uVar35;
  ulong unaff_RBP;
  secp256k1_modinv64_modinfo *psVar36;
  uint8_t *puVar37;
  uint uVar38;
  uint uVar39;
  secp256k1_modinv64_modinfo *psVar40;
  ulong uVar41;
  secp256k1_modinv64_modinfo *psVar42;
  long lVar43;
  secp256k1_modinv32_signed30 *psVar44;
  secp256k1_fe *psVar45;
  secp256k1_fe *psVar46;
  secp256k1_fe *r;
  secp256k1_modinv64_modinfo *psVar47;
  secp256k1_modinv64_modinfo *psVar48;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar49;
  ulong uVar50;
  secp256k1_fe *r_00;
  uchar *__s;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  int iVar54;
  uint uVar55;
  secp256k1_modinv64_modinfo *psVar56;
  int *piVar57;
  uint uVar58;
  uint uVar59;
  secp256k1_modinv64_modinfo *psVar60;
  secp256k1_modinv64_modinfo *psVar61;
  secp256k1_modinv32_modinfo *modinfo;
  secp256k1_modinv32_modinfo *psVar62;
  secp256k1_modinv32_signed30 *psVar63;
  uint uVar64;
  code *unaff_R13;
  secp256k1_modinv32_signed30 *psVar65;
  size_t count;
  uint uVar66;
  secp256k1_modinv64_modinfo *psVar67;
  secp256k1_modinv64_modinfo *psVar68;
  code *pcVar69;
  bool bVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  secp256k1_modinv32_signed30 x;
  secp256k1_modinv32_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  ulong uStack_1830;
  secp256k1_fe *psStack_1828;
  uchar auStack_1820 [4232];
  secp256k1_fe *psStack_798;
  code *pcStack_790;
  undefined8 uStack_788;
  secp256k1_fe *psStack_780;
  code *pcStack_778;
  code *pcStack_770;
  undefined1 auStack_768 [36];
  int iStack_744;
  int iStack_740;
  int iStack_73c;
  int iStack_738;
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  undefined1 auStack_728 [48];
  code *pcStack_6f8;
  secp256k1_fe sStack_6f0;
  secp256k1_fe sStack_6c0;
  secp256k1_fe sStack_690;
  ulong uStack_658;
  ulong uStack_650;
  ulong uStack_648;
  secp256k1_modinv32_signed30 *psStack_640;
  ulong uStack_638;
  code *pcStack_630;
  uint uStack_628;
  uint uStack_624;
  uint uStack_620;
  uint uStack_61c;
  uint uStack_618;
  uint uStack_614;
  secp256k1_modinv32_signed30 *psStack_610;
  uint uStack_604;
  uint uStack_600;
  uint uStack_5fc;
  uint uStack_5f8;
  int32_t iStack_5f4;
  secp256k1_modinv32_signed30 *psStack_5f0;
  secp256k1_modinv32_signed30 *psStack_5e8;
  secp256k1_modinv32_signed30 *psStack_5e0;
  secp256k1_modinv32_signed30 *psStack_5d8;
  secp256k1_modinv32_signed30 *psStack_5d0;
  code *pcStack_5c8;
  long lStack_5b8;
  long lStack_5b0;
  int *piStack_5a8;
  secp256k1_modinv32_modinfo *psStack_5a0;
  ulong uStack_598;
  ulong uStack_588;
  code *pcStack_580;
  secp256k1_modinv32_signed30 *psStack_578;
  int *piStack_568;
  secp256k1_modinv32_modinfo *psStack_560;
  ulong uStack_558;
  ulong uStack_548;
  code *pcStack_540;
  secp256k1_modinv32_signed30 sStack_538;
  secp256k1_modinv32_signed30 sStack_514;
  secp256k1_modinv64_modinfo *psStack_4f0;
  secp256k1_modinv64_modinfo *psStack_4e8;
  secp256k1_modinv32_modinfo *psStack_4d8;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  secp256k1_modinv64_modinfo sStack_4c0;
  secp256k1_modinv32_trans2x2 sStack_490;
  secp256k1_modinv64_modinfo sStack_480;
  secp256k1_modinv64_modinfo *psStack_450;
  long lStack_448;
  secp256k1_modinv64_modinfo sStack_440;
  secp256k1_modinv32_signed30 sStack_410;
  secp256k1_modinv64_modinfo *psStack_3e8;
  secp256k1_modinv32_modinfo *psStack_3e0;
  secp256k1_modinv64_modinfo *psStack_3d8;
  secp256k1_modinv64_modinfo *psStack_3d0;
  secp256k1_modinv64_modinfo *psStack_3c8;
  code *pcStack_3c0;
  uint uStack_3ac;
  secp256k1_modinv32_trans2x2 sStack_3a8;
  secp256k1_modinv64_modinfo sStack_398;
  secp256k1_modinv64_modinfo sStack_368;
  secp256k1_modinv64_modinfo *psStack_338;
  secp256k1_modinv64_modinfo *psStack_330;
  secp256k1_modinv64_modinfo sStack_328;
  secp256k1_modinv32_signed30 sStack_2f8;
  secp256k1_modinv64_modinfo *psStack_2d0;
  secp256k1_modinv64_modinfo *psStack_2c8;
  ulong uStack_2c0;
  secp256k1_modinv64_modinfo *psStack_2b8;
  secp256k1_modinv64_modinfo *psStack_2b0;
  secp256k1_modinv64_modinfo *psStack_2a8;
  int iStack_298;
  int iStack_294;
  secp256k1_modinv32_trans2x2 sStack_290;
  secp256k1_modinv64_modinfo sStack_280;
  secp256k1_modinv64_modinfo sStack_250;
  secp256k1_modinv64_modinfo *psStack_220;
  secp256k1_modinv64_modinfo *psStack_218;
  ulong uStack_210;
  secp256k1_modinv64_modinfo *psStack_208;
  secp256k1_modinv64_modinfo *psStack_200;
  ulong uStack_1f8;
  secp256k1_modinv64_modinfo *psStack_1f0;
  secp256k1_modinv64_modinfo *psStack_1e8;
  code *pcStack_1e0;
  code *pcStack_1d8;
  secp256k1_modinv64_modinfo sStack_1d0;
  secp256k1_modinv64_modinfo sStack_1a0;
  secp256k1_modinv64_modinfo sStack_170;
  uint16_t uStack_140;
  undefined8 uStack_13e;
  undefined6 uStack_136;
  undefined2 uStack_130;
  undefined6 uStack_12e;
  int64_t iStack_128;
  uint16_t *puStack_118;
  ulong uStack_110;
  code *pcStack_108;
  uint16_t *puStack_100;
  uint16_t *puStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_modinfo local_e8;
  secp256k1_modinv64_modinfo local_b8;
  secp256k1_modinv64_modinfo local_88;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  
  psVar36 = &local_e8;
  psVar68 = &local_e8;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar13 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar13 / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((in[uVar13 >> 4] >> (uVar13 & 0xf) & 1) != 0) <<
                        ((char)(uVar13 / 0x1e) * -0x1e + (char)uVar13 & 0x1fU);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x100);
  uVar58 = local_e8.modulus.v[0]._4_4_ | (uint)local_e8.modulus.v[0] | (uint)local_e8.modulus.v[1] |
           local_e8.modulus.v[1]._4_4_ | (uint)local_e8.modulus.v[2] | local_e8.modulus.v[2]._4_4_ |
           (uint)local_e8.modulus.v[3] | local_e8.modulus.v[3]._4_4_ | (uint)local_e8.modulus.v[4];
  uVar51 = (ulong)uVar58;
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4]._0_4_ = 0;
  uVar13 = 0;
  do {
    psVar40 = (secp256k1_modinv64_modinfo *)((ulong)uVar13 / 0x1e);
    puVar2 = (uint *)((long)local_b8.modulus.v + (long)psVar40 * 4);
    *puVar2 = *puVar2 | (uint)((mod[uVar13 >> 4] >> (uVar13 & 0xf) & 1) != 0) <<
                        ((char)(uVar13 / 0x1e) * -0x1e + (char)uVar13 & 0x1fU);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x100);
  psVar47 = (secp256k1_modinv64_modinfo *)(long)(int)local_b8.modulus.v[0];
  pcStack_f0 = (code *)0x14b0c1;
  uVar17 = modinv2p64((uint64_t)psVar47);
  local_b8.modulus.v[4]._4_4_ = (uint)uVar17 & 0x3fffffff;
  puVar27 = mod;
  if (((uint)uVar17 * (int)local_b8.modulus.v[0] & 0x3fffffff) != 1) goto LAB_0014b46e;
  if (uVar58 == 0) {
LAB_0014b212:
    local_e8.modulus.v[2] = 0;
    local_e8.modulus.v[3] = 0;
    local_e8.modulus.v[0] = 0;
    local_e8.modulus.v[1] = 0;
    local_e8.modulus.v[4]._0_4_ = 0;
    uVar13 = 0;
    do {
      puVar2 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar13 / 0x1e) * 4);
      *puVar2 = *puVar2 | (uint)((in[uVar13 >> 4] >> (uVar13 & 0xf) & 1) != 0) <<
                          ((char)(uVar13 / 0x1e) * -0x1e + (char)uVar13 & 0x1fU);
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x100);
    iVar14 = 0x10;
    do {
      uVar51 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
               >> 0x3d;
      iVar22 = *(int *)((long)local_b8.modulus.v + uVar51 * 4);
      if ((iVar22 < 1) ||
         (iVar54 = *(int *)((long)local_b8.modulus.v + uVar51 * 4 + 4), 0x3fffffff < iVar54)) {
        if ((iVar22 < 0) &&
           (iVar54 = *(int *)((long)local_b8.modulus.v + uVar51 * 4 + 4), 0x3ffffffe < iVar54)) {
          *(int *)((long)local_b8.modulus.v + uVar51 * 4) = iVar22 + 0x40000000;
          iVar54 = iVar54 + -1;
          goto LAB_0014b2e3;
        }
      }
      else {
        *(int *)((long)local_b8.modulus.v + uVar51 * 4) = iVar22 + -0x40000000;
        iVar54 = iVar54 + 1;
LAB_0014b2e3:
        *(int *)((long)local_b8.modulus.v + uVar51 * 4 + 4) = iVar54;
      }
      uVar52 = secp256k1_test_state[1] << 0x11;
      uVar41 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar51 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar41;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar51;
      secp256k1_test_state[2] = uVar41 ^ uVar52;
      secp256k1_test_state[3] = uVar51 << 0x2d | uVar51 >> 0x13;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    unaff_RBP = (ulong)(uVar58 != 0);
    puVar27 = (uint16_t *)0x0;
    uVar51 = 0x88888889;
    local_88.modulus_inv62 = (uint64_t)mod;
    while( true ) {
      iVar14 = (int)puVar27;
      unaff_R13 = secp256k1_modinv32_var;
      if (iVar14 == 0) {
        unaff_R13 = secp256k1_modinv32;
      }
      pcStack_f0 = (code *)0x14b35a;
      (*unaff_R13)(&local_e8,&local_b8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar13 = 0;
      do {
        out[uVar13 >> 4] =
             out[uVar13 >> 4] |
             (ushort)((*(uint *)((long)local_e8.modulus.v + ((ulong)uVar13 / 0x1e) * 4) >>
                       uVar13 % 0x1e & 1) != 0) << ((byte)uVar13 & 0xf);
        uVar13 = uVar13 + 1;
      } while (uVar13 != 0x100);
      psVar47 = &local_88;
      pcStack_f0 = (code *)0x14b3b5;
      psVar40 = (secp256k1_modinv64_modinfo *)out;
      mulmod256((uint16_t *)psVar47,out,in,(uint16_t *)local_88.modulus_inv62);
      if ((ushort)local_88.modulus.v[0] != (uVar58 != 0)) break;
      lVar18 = 1;
      do {
        if (*(short *)((long)local_88.modulus.v + lVar18 * 2) != 0) {
          pcStack_f0 = (code *)0x14b464;
          test_modinv32_uint16_cold_4();
          goto LAB_0014b464;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      pcStack_f0 = (code *)0x14b3e5;
      psVar47 = &local_e8;
      (*unaff_R13)(&local_e8,&local_b8);
      local_88.modulus.v[2] = 0;
      local_88.modulus.v[3] = 0;
      local_88.modulus.v[0] = 0;
      local_88.modulus.v[1] = 0;
      uVar13 = 0;
      do {
        uVar38 = (uint)((*(uint *)((long)local_e8.modulus.v + ((ulong)uVar13 / 0x1e) * 4) >>
                         uVar13 % 0x1e & 1) != 0) << ((byte)uVar13 & 0xf);
        psVar40 = (secp256k1_modinv64_modinfo *)(ulong)uVar38;
        puVar4 = (ushort *)((long)local_88.modulus.v + (ulong)(uVar13 >> 4) * 2);
        *puVar4 = *puVar4 | (ushort)uVar38;
        uVar13 = uVar13 + 1;
      } while (uVar13 != 0x100);
      lVar18 = 0;
      do {
        if (*(uint16_t *)((long)local_88.modulus.v + lVar18 * 2) != in[lVar18]) goto LAB_0014b464;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      puVar27 = (uint16_t *)(ulong)(iVar14 + 1);
      if (iVar14 != 0) {
        return;
      }
    }
    goto LAB_0014b469;
  }
  pcStack_f0 = (code *)0x14b0fa;
  mulmod256((uint16_t *)&local_88,in,in,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar13 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar13 / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar13 >> 4) * 2) >>
                                (uVar13 & 0xf) & 1) != 0) <<
                        ((char)(uVar13 / 0x1e) * -0x1e + (char)uVar13 & 0x1fU);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x100);
  psVar40 = &local_b8;
  pcStack_f0 = (code *)0x14b15d;
  uVar13 = secp256k1_jacobi32_maybe_var
                     ((secp256k1_modinv32_signed30 *)&local_e8,(secp256k1_modinv32_modinfo *)psVar40
                     );
  if (1 < uVar13) goto LAB_0014b473;
  local_58 = *mod - 1;
  local_56 = *(undefined8 *)(mod + 1);
  uStack_40 = *(undefined8 *)(mod + 0xc);
  uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
  uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
  uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
  pcStack_f0 = (code *)0x14b196;
  mulmod256((uint16_t *)&local_88,(uint16_t *)&local_88,&local_58,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar13 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar13 / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar13 >> 4) * 2) >>
                                (uVar13 & 0xf) & 1) != 0) <<
                        ((char)(uVar13 / 0x1e) * -0x1e + (char)uVar13 & 0x1fU);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x100);
  psVar40 = &local_b8;
  pcStack_f0 = (code *)0x14b1f9;
  iVar14 = secp256k1_jacobi32_maybe_var
                     ((secp256k1_modinv32_signed30 *)&local_e8,(secp256k1_modinv32_modinfo *)psVar40
                     );
  if ((iVar14 == 0) || (iVar14 == 1 - (*mod & 2))) goto LAB_0014b212;
LAB_0014b478:
  pcStack_f0 = test_modinv64_uint16;
  test_modinv32_uint16_cold_2();
  pcStack_f0 = (code *)unaff_RBP;
  puStack_f8 = out;
  puStack_100 = in;
  pcStack_108 = unaff_R13;
  uStack_110 = uVar51;
  puStack_118 = puVar27;
  psVar42 = &sStack_1d0;
  psVar47 = &sStack_1d0;
  sStack_1d0.modulus.v[0] = 0;
  sStack_1d0.modulus.v[1] = 0;
  sStack_1d0.modulus.v[2] = 0;
  sStack_1d0.modulus.v[3] = 0;
  sStack_1d0.modulus.v[4] = 0;
  uVar51 = 0;
  psVar36 = (secp256k1_modinv64_modinfo *)0x8421084210842109;
  do {
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar51 >> 1;
    puVar3 = (ulong *)((long)sStack_1d0.modulus.v +
                      (ulong)((uint)((uVar51 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8))
    ;
    *puVar3 = *puVar3 | (ulong)((*(ushort *)
                                  ((long)(psVar40->modulus).v + (uVar51 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar51 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar75 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar51 & 0x3fU);
    uVar51 = uVar51 + 1;
  } while ((int)uVar51 != 0x100);
  psVar60 = (secp256k1_modinv64_modinfo *)
            (sStack_1d0.modulus.v[1] | sStack_1d0.modulus.v[0] | sStack_1d0.modulus.v[2] |
             sStack_1d0.modulus.v[3] | sStack_1d0.modulus.v[4]);
  sStack_1a0.modulus.v[0] = 0;
  sStack_1a0.modulus.v[1] = 0;
  sStack_1a0.modulus.v[2] = 0;
  sStack_1a0.modulus.v[3] = 0;
  sStack_1a0.modulus.v[4] = 0;
  psVar30 = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (ulong)psVar30 >> 1;
    puVar3 = (ulong *)((long)sStack_1a0.modulus.v +
                      (ulong)((uint)(((ulong)psVar30 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                             0xfffffff8));
    *puVar3 = *puVar3 | (ulong)((*(ushort *)
                                  ((long)(m_00->modulus).v + ((ulong)psVar30 >> 4 & 0xfffffff) * 2)
                                 >> ((uint)psVar30 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar6 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)psVar30 & 0x3fU);
    psVar30 = (secp256k1_modinv64_modinfo *)((long)(psVar30->modulus).v + 1);
  } while ((int)psVar30 != 0x100);
  uVar51 = 0x3fffffffffffffff;
  pcStack_1d8 = (code *)0x14b5aa;
  psVar48 = (secp256k1_modinv64_modinfo *)sStack_1a0.modulus.v[0];
  uVar17 = modinv2p64(sStack_1a0.modulus.v[0]);
  sStack_1a0.modulus_inv62 = uVar17 & 0x3fffffffffffffff;
  pcVar29 = (code *)m_00;
  if ((uVar17 * sStack_1a0.modulus.v[0] & 0x3fffffffffffffff) == 1) {
    if (psVar60 == (secp256k1_modinv64_modinfo *)0x0) {
LAB_0014b72c:
      sStack_170.modulus_inv62 = (uint64_t)m_00;
      sStack_1d0.modulus.v[2] = 0;
      sStack_1d0.modulus.v[3] = 0;
      sStack_1d0.modulus.v[0] = 0;
      sStack_1d0.modulus.v[1] = 0;
      sStack_1d0.modulus.v[4] = 0;
      uVar51 = 0;
      do {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar51 >> 1;
        puVar3 = (ulong *)((long)sStack_1d0.modulus.v +
                          (ulong)((uint)((uVar51 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                                 0xfffffff8));
        *puVar3 = *puVar3 | (ulong)((*(ushort *)
                                      ((long)(psVar40->modulus).v + (uVar51 >> 4 & 0xfffffff) * 2)
                                     >> ((uint)uVar51 & 0xf) & 1) != 0) <<
                            ((char)(SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                             (char)uVar51 & 0x3fU);
        uVar51 = uVar51 + 1;
      } while ((int)uVar51 != 0x100);
      iVar14 = 8;
      do {
        uVar51 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                 secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) +
                 secp256k1_test_state[0] >> 0x3e;
        lVar18 = sStack_1a0.modulus.v[uVar51];
        if ((lVar18 < 1) || (lVar28 = sStack_1a0.modulus.v[uVar51 + 1], 0x3fffffffffffffff < lVar28)
           ) {
          if ((lVar18 < 0) &&
             (lVar28 = sStack_1a0.modulus.v[uVar51 + 1], -0x4000000000000000 < lVar28)) {
            sStack_1a0.modulus.v[uVar51] = lVar18 + 0x4000000000000000;
            lVar28 = lVar28 + -1;
            goto LAB_0014b81f;
          }
        }
        else {
          sStack_1a0.modulus.v[uVar51] = lVar18 + -0x4000000000000000;
          lVar28 = lVar28 + 1;
LAB_0014b81f:
          sStack_1a0.modulus.v[uVar51 + 1] = lVar28;
        }
        uVar52 = secp256k1_test_state[1] << 0x11;
        uVar41 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
        uVar51 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
        secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar41;
        secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar51;
        secp256k1_test_state[2] = uVar41 ^ uVar52;
        secp256k1_test_state[3] = uVar51 << 0x2d | uVar51 >> 0x13;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
      sStack_1d0.modulus_inv62._4_4_ = (uint)(psVar60 != (secp256k1_modinv64_modinfo *)0x0);
      psVar60 = (secp256k1_modinv64_modinfo *)0x0;
      uVar51 = 0x84210843;
      while( true ) {
        iVar14 = (int)psVar60;
        pcVar29 = secp256k1_modinv64_var;
        if (iVar14 == 0) {
          pcVar29 = secp256k1_modinv64;
        }
        pcStack_1d8 = (code *)0x14b894;
        (*pcVar29)(&sStack_1d0);
        (psVar68->modulus).v[2] = 0;
        (psVar68->modulus).v[3] = 0;
        (psVar68->modulus).v[0] = 0;
        (psVar68->modulus).v[1] = 0;
        uVar41 = 0;
        do {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar41 >> 1;
          puVar4 = (ushort *)((long)(psVar68->modulus).v + (uVar41 >> 4 & 0xfffffff) * 2);
          *puVar4 = *puVar4 | (ushort)((*(ulong *)((long)sStack_1d0.modulus.v +
                                                  (ulong)((uint)((uVar41 >> 1 & 0x7fffffff) *
                                                                 0x84210843 >> 0x21) & 0xfffffff8))
                                        >> ((ulong)((SUB164(auVar10 * ZEXT816(0x8421084210842109),8)
                                                    >> 4) * 2 + (int)uVar41) & 0x3f) & 1) != 0) <<
                              ((byte)uVar41 & 0xf);
          uVar41 = uVar41 + 1;
        } while ((int)uVar41 != 0x100);
        psVar48 = &sStack_170;
        pcStack_1d8 = (code *)0x14b904;
        psVar30 = psVar68;
        mulmod256((uint16_t *)psVar48,(uint16_t *)psVar68,(uint16_t *)psVar40,
                  (uint16_t *)sStack_170.modulus_inv62);
        if ((short)sStack_170.modulus.v[0] != (short)sStack_1d0.modulus_inv62._4_4_) break;
        lVar18 = 1;
        do {
          if (*(short *)((long)sStack_170.modulus.v + lVar18 * 2) != 0) {
            pcStack_1d8 = (code *)0x14b9cf;
            test_modinv64_uint16_cold_4();
            goto LAB_0014b9cf;
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        pcStack_1d8 = (code *)0x14b937;
        (*pcVar29)(&sStack_1d0);
        sStack_170.modulus.v[2] = 0;
        sStack_170.modulus.v[3] = 0;
        sStack_170.modulus.v[0] = 0;
        sStack_170.modulus.v[1] = 0;
        psVar30 = (secp256k1_modinv64_modinfo *)0x0;
        do {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = (ulong)psVar30 >> 1;
          psVar48 = (secp256k1_modinv64_modinfo *)
                    ((ulong)((*(ulong *)((long)sStack_1d0.modulus.v +
                                        (ulong)((uint)(((ulong)psVar30 >> 1 & 0x7fffffff) *
                                                       0x84210843 >> 0x21) & 0xfffffff8)) >>
                              ((ulong)((SUB164(auVar11 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                      (int)psVar30) & 0x3f) & 1) != 0) << ((byte)psVar30 & 0xf));
          puVar4 = (ushort *)((long)sStack_170.modulus.v + ((ulong)psVar30 >> 4 & 0xfffffff) * 2);
          *puVar4 = *puVar4 | (ushort)psVar48;
          psVar30 = (secp256k1_modinv64_modinfo *)((long)(psVar30->modulus).v + 1);
        } while ((int)psVar30 != 0x100);
        lVar18 = 0;
        do {
          if (*(short *)((long)sStack_170.modulus.v + lVar18 * 2) !=
              *(short *)((long)(psVar40->modulus).v + lVar18 * 2)) goto LAB_0014b9cf;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        psVar60 = (secp256k1_modinv64_modinfo *)(ulong)(iVar14 + 1);
        if (iVar14 != 0) {
          return;
        }
      }
LAB_0014b9d4:
      pcStack_1d8 = (code *)0x14b9d9;
      test_modinv64_uint16_cold_3();
      goto LAB_0014b9d9;
    }
    pcStack_1d8 = (code *)0x14b5e4;
    mulmod256((uint16_t *)&sStack_170,(uint16_t *)psVar40,(uint16_t *)psVar40,(uint16_t *)m_00);
    sStack_1d0.modulus.v[2] = 0;
    sStack_1d0.modulus.v[3] = 0;
    sStack_1d0.modulus.v[0] = 0;
    sStack_1d0.modulus.v[1] = 0;
    sStack_1d0.modulus.v[4] = 0;
    uVar41 = 0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar41 >> 1;
      puVar3 = (ulong *)((long)sStack_1d0.modulus.v +
                        (ulong)((uint)((uVar41 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8
                               ));
      *puVar3 = *puVar3 | (ulong)((*(ushort *)
                                    ((long)sStack_170.modulus.v + (uVar41 >> 4 & 0xfffffff) * 2) >>
                                   ((uint)uVar41 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar41 & 0x3fU);
      uVar41 = uVar41 + 1;
    } while ((int)uVar41 != 0x100);
    psVar30 = &sStack_1a0;
    pcStack_1d8 = (code *)0x14b65f;
    uVar13 = secp256k1_jacobi64_maybe_var(&sStack_1d0.modulus,psVar30);
    if (1 < uVar13) goto LAB_0014b9de;
    uStack_140 = (short)(m_00->modulus).v[0] - 1;
    uStack_13e = *(undefined8 *)((long)(m_00->modulus).v + 2);
    iVar12 = (m_00->modulus).v[2];
    iStack_128 = (m_00->modulus).v[3];
    uStack_136 = (undefined6)*(undefined8 *)((long)(m_00->modulus).v + 10);
    uStack_130 = (undefined2)iVar12;
    uStack_12e = (undefined6)((ulong)iVar12 >> 0x10);
    pcStack_1d8 = (code *)0x14b698;
    mulmod256((uint16_t *)&sStack_170,(uint16_t *)&sStack_170,&uStack_140,(uint16_t *)m_00);
    sStack_1d0.modulus.v[2] = 0;
    sStack_1d0.modulus.v[3] = 0;
    sStack_1d0.modulus.v[0] = 0;
    sStack_1d0.modulus.v[1] = 0;
    sStack_1d0.modulus.v[4] = 0;
    uVar41 = 0;
    do {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar41 >> 1;
      puVar3 = (ulong *)((long)sStack_1d0.modulus.v +
                        (ulong)((uint)((uVar41 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8
                               ));
      *puVar3 = *puVar3 | (ulong)((*(ushort *)
                                    ((long)sStack_170.modulus.v + (uVar41 >> 4 & 0xfffffff) * 2) >>
                                   ((uint)uVar41 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar41 & 0x3fU);
      uVar41 = uVar41 + 1;
    } while ((int)uVar41 != 0x100);
    psVar30 = &sStack_1a0;
    pcStack_1d8 = (code *)0x14b713;
    iVar14 = secp256k1_jacobi64_maybe_var(&sStack_1d0.modulus,psVar30);
    if ((iVar14 == 0) || (iVar14 == 1 - ((ushort)(m_00->modulus).v[0] & 2))) goto LAB_0014b72c;
  }
  else {
LAB_0014b9d9:
    pcStack_1d8 = (code *)0x14b9de;
    test_modinv64_uint16_cold_1();
    psVar42 = psVar48;
LAB_0014b9de:
    psVar47 = psVar42;
    pcStack_1d8 = (code *)0x14b9e3;
    test_modinv64_uint16_cold_6();
  }
  pcStack_1d8 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar47 & 1) != 0) {
    iVar14 = 6;
    do {
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    return;
  }
  pcStack_1e0 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_1e0 = (code *)0x8421084210842109;
  psStack_1e8 = psVar68;
  psStack_1f0 = psVar40;
  uStack_1f8 = uVar51;
  psStack_200 = psVar60;
  psStack_208 = (secp256k1_modinv64_modinfo *)pcVar29;
  sStack_250.modulus.v[4]._0_4_ = (int32_t)(psVar30->modulus).v[4];
  sStack_250.modulus.v[2] = (psVar30->modulus).v[2];
  sStack_250.modulus.v[3] = (psVar30->modulus).v[3];
  sStack_250.modulus.v[0] = (psVar30->modulus).v[0];
  sStack_250.modulus.v[1] = (psVar30->modulus).v[1];
  iVar12 = (psVar47->modulus).v[0];
  sStack_280.modulus.v[1] = (psVar47->modulus).v[1];
  piVar1 = (psVar47->modulus).v + 2;
  sStack_280.modulus.v[2] = *piVar1;
  sStack_280.modulus.v[3] = (psVar47->modulus).v[3];
  sStack_280.modulus.v[0]._0_4_ = (uint)iVar12;
  sStack_280.modulus.v[0]._4_4_ = (uint)((ulong)iVar12 >> 0x20);
  sStack_280.modulus.v[4]._0_4_ = (int)(psVar47->modulus).v[4];
  auVar75 = packssdw(*(undefined1 (*) [16])(psVar47->modulus).v,*(undefined1 (*) [16])piVar1);
  psVar42 = psVar30;
  if (((((((((auVar75 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar75 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar75 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar75 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar75 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar75[0xf]) &&
     (-1 < (int)sStack_280.modulus.v[4])) {
    uVar13 = (uint)((ulong)sStack_280.modulus.v[1] >> 0x20) | (uint)sStack_280.modulus.v[1] |
             sStack_280.modulus.v[0]._4_4_ | (uint)sStack_280.modulus.v[0];
    psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uVar13;
    psVar48 = psVar36;
    psVar67 = psVar40;
    if (((int)((ulong)sStack_280.modulus.v[3] >> 0x20) != 0 ||
        (((int)sStack_280.modulus.v[3] != 0 ||
         ((int)((ulong)sStack_280.modulus.v[2] >> 0x20) != 0 || (int)sStack_280.modulus.v[2] != 0))
        || uVar13 != 0)) || (int)sStack_280.modulus.v[4] != 0) {
      psVar67 = (secp256k1_modinv64_modinfo *)0x9;
      uVar51 = 0xffffffff;
      iStack_294 = 0;
      psVar60 = (secp256k1_modinv64_modinfo *)0x0;
      psStack_220 = psVar30;
      do {
        psVar30 = psStack_220;
        uVar26 = sStack_250.modulus.v[0]._4_4_ << 0x1e | (uint)sStack_250.modulus.v[0];
        pcVar29 = (code *)(ulong)uVar26;
        uVar39 = sStack_280.modulus.v[0]._4_4_ << 0x1e | (uint)sStack_280.modulus.v[0];
        psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
        uVar13 = 1;
        psVar56 = (secp256k1_modinv64_modinfo *)0x0;
        uVar15 = 0x1e;
        psVar47 = (secp256k1_modinv64_modinfo *)0x0;
        uVar58 = 1;
        psVar36 = (secp256k1_modinv64_modinfo *)pcVar29;
        psVar61 = psVar60;
        uVar38 = uVar39;
        while( true ) {
          uVar55 = (uint)psVar36;
          uVar34 = -1 << ((byte)uVar15 & 0x1f) | uVar38;
          uVar21 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
            }
          }
          bVar20 = (byte)uVar21;
          uVar38 = uVar38 >> (bVar20 & 0x1f);
          uVar58 = uVar58 << (bVar20 & 0x1f);
          uVar34 = (int)psVar47 << (bVar20 & 0x1f);
          psVar47 = (secp256k1_modinv64_modinfo *)(ulong)uVar34;
          uVar64 = (int)uVar51 - uVar21;
          uVar51 = (ulong)uVar64;
          psVar48 = (secp256k1_modinv64_modinfo *)((ulong)psVar36 >> 1);
          uVar59 = ((uint)((ulong)psVar36 >> 2) ^ (uint)psVar48) & uVar21 ^ (uint)psVar61;
          psVar60 = (secp256k1_modinv64_modinfo *)(ulong)uVar59;
          uVar15 = uVar15 - uVar21;
          uVar21 = (uint)psVar56;
          psStack_218 = psVar67;
          if (uVar15 == 0) break;
          if (((ulong)psVar36 & 1) == 0) {
            psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be33;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_0014be33:
            psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be38;
            secp256k1_jacobi32_maybe_var_cold_5();
            psVar40 = psVar61;
LAB_0014be38:
            psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be3d;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_0014be3d:
            psVar36 = psVar48;
            psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be42;
            secp256k1_jacobi32_maybe_var_cold_2();
LAB_0014be42:
            psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be47;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_0014be47;
          }
          if ((uVar38 & 1) == 0) goto LAB_0014be33;
          uVar35 = uVar34 * uVar39 + uVar58 * uVar26;
          psVar48 = (secp256k1_modinv64_modinfo *)(ulong)uVar35;
          bVar20 = 0x1e - (char)uVar15;
          uVar66 = uVar55 << (bVar20 & 0x1f);
          psVar40 = (secp256k1_modinv64_modinfo *)(ulong)uVar66;
          if (uVar35 != uVar66) goto LAB_0014be38;
          uVar66 = uVar13 * uVar39 + uVar21 * uVar26;
          psVar40 = (secp256k1_modinv64_modinfo *)(ulong)uVar66;
          uVar35 = uVar38 << (bVar20 & 0x1f);
          psVar48 = (secp256k1_modinv64_modinfo *)(ulong)uVar35;
          if (uVar66 != uVar35) goto LAB_0014be3d;
          psVar40 = psVar56;
          if ((int)uVar64 < 0) {
            uVar51 = (ulong)-uVar64;
            psVar60 = (secp256k1_modinv64_modinfo *)(ulong)(uVar59 ^ (uVar38 & uVar55) >> 1);
            psVar36 = (secp256k1_modinv64_modinfo *)(ulong)uVar38;
            psVar47 = (secp256k1_modinv64_modinfo *)(ulong)uVar13;
            psVar40 = (secp256k1_modinv64_modinfo *)(ulong)uVar58;
            uVar58 = uVar21;
            uVar38 = uVar55;
            uVar13 = uVar34;
          }
          psVar68 = (secp256k1_modinv64_modinfo *)(ulong)uVar13;
          uVar21 = (int)uVar51 + 1;
          if ((int)uVar15 <= (int)uVar21) {
            uVar21 = uVar15;
          }
          if (0x1e < uVar21) goto LAB_0014be42;
          uVar21 = (uint)(0xff << (-(char)uVar21 & 0x1fU)) >> (-(char)uVar21 & 0x1fU);
          uVar55 = secp256k1_modinv32_inv256[(uint)((ulong)psVar36 >> 1) & 0x7f] * uVar38 & uVar21;
          uVar38 = uVar55 * (int)psVar36 + uVar38;
          psVar56 = (secp256k1_modinv64_modinfo *)(ulong)(uVar55 * uVar58 + (int)psVar40);
          uVar13 = uVar55 * (int)psVar47 + uVar13;
          psVar61 = psVar60;
          uStack_210 = uVar51;
          if ((uVar38 & uVar21) != 0) {
LAB_0014be47:
            psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be4c;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_0014be4c;
          }
        }
        lVar18 = (long)(int)uVar13 * (long)(int)uVar58 - (long)(int)uVar21 * (long)(int)uVar34;
        psVar68 = &sStack_250;
        sStack_290.u = uVar58;
        sStack_290.v = uVar34;
        sStack_290.q = uVar21;
        sStack_290.r = uVar13;
        if ((lVar18 != -0x40000000) && (lVar18 != 0x40000000)) goto LAB_0014be7e;
        iVar22 = (int)psVar67;
        psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14bccd;
        psVar42 = psVar67;
        psVar47 = psVar68;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar68,iVar22,
                            (secp256k1_modinv32_signed30 *)psStack_220,0);
        psVar36 = &sStack_280;
        if (iVar14 < 1) goto LAB_0014be51;
        psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14bced;
        psVar42 = psVar67;
        psVar47 = psVar68;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar68,iVar22,
                            (secp256k1_modinv32_signed30 *)psVar30,1);
        if (0 < iVar14) goto LAB_0014be56;
        psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14bd05;
        psVar42 = psVar67;
        psVar47 = psVar36;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar36,iVar22,
                            (secp256k1_modinv32_signed30 *)psVar30,0);
        if (iVar14 < 1) goto LAB_0014be5b;
        psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14bd20;
        psVar42 = psVar67;
        psVar47 = psVar36;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar36,iVar22,
                            (secp256k1_modinv32_signed30 *)psVar30,1);
        if (-1 < iVar14) goto LAB_0014be60;
        psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14bd3b;
        secp256k1_modinv32_update_fg_30_var
                  (iVar22,(secp256k1_modinv32_signed30 *)psVar68,
                   (secp256k1_modinv32_signed30 *)psVar36,&sStack_290);
        if ((uint)sStack_250.modulus.v[0] == 1) {
          if (1 < iVar22) {
            uVar13 = 0;
            psVar40 = (secp256k1_modinv64_modinfo *)0x1;
            do {
              uVar13 = uVar13 | *(uint *)((long)sStack_250.modulus.v + (long)psVar40 * 4);
              psVar40 = (secp256k1_modinv64_modinfo *)((long)(psVar40->modulus).v + 1);
            } while (psVar67 != psVar40);
            if (uVar13 != 0) goto LAB_0014bd6a;
          }
          iStack_298 = 1 - (uVar59 * 2 & 2);
          bVar70 = false;
        }
        else {
LAB_0014bd6a:
          if ((-1 < iVar22 + -2 && *(int *)((long)sStack_250.modulus.v + (long)iVar22 * 4 + -4) == 0
              ) && *(int *)((long)sStack_280.modulus.v + (long)iVar22 * 4 + -4) == 0) {
            psVar67 = (secp256k1_modinv64_modinfo *)(ulong)(iVar22 - 1);
          }
          psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14bd94;
          iVar22 = (int)psVar67;
          psVar42 = psVar67;
          psVar47 = psVar68;
          iVar14 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar68,iVar22,
                              (secp256k1_modinv32_signed30 *)psVar30,0);
          if (iVar14 < 1) goto LAB_0014be65;
          psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14bdaf;
          psVar42 = psVar67;
          psVar47 = psVar68;
          iVar14 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar68,iVar22,
                              (secp256k1_modinv32_signed30 *)psVar30,1);
          if (0 < iVar14) goto LAB_0014be6a;
          psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14bdc7;
          psVar42 = psVar67;
          psVar47 = psVar36;
          iVar14 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar36,iVar22,
                              (secp256k1_modinv32_signed30 *)psVar30,0);
          if (iVar14 < 1) goto LAB_0014be6f;
          psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14bde2;
          psVar42 = psVar67;
          psVar47 = psVar36;
          iVar14 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar36,iVar22,
                              (secp256k1_modinv32_signed30 *)psVar30,1);
          bVar70 = true;
          if (-1 < iVar14) goto LAB_0014be74;
        }
        if ((!bVar70) || (iStack_294 = iStack_294 + 1, iStack_294 == 0x19)) {
          return;
        }
      } while( true );
    }
  }
  else {
LAB_0014be4c:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be51;
    secp256k1_jacobi32_maybe_var_cold_17();
    psVar30 = (secp256k1_modinv64_modinfo *)pcVar29;
    psVar67 = psVar40;
LAB_0014be51:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be56;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_0014be56:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be5b;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_0014be5b:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be60;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_0014be60:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be65;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_0014be65:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be6a;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_0014be6a:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be6f;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_0014be6f:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be74;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_0014be74:
    psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be79;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar48 = psVar36;
  }
  psStack_2a8 = (secp256k1_modinv64_modinfo *)0x14be7e;
  secp256k1_jacobi32_maybe_var_cold_16();
LAB_0014be7e:
  psStack_2a8 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  psStack_2a8 = psVar48;
  psStack_2b0 = psVar68;
  psStack_2b8 = psVar67;
  uStack_2c0 = uVar51;
  psStack_2c8 = psVar60;
  psStack_2d0 = psVar30;
  psVar68 = (secp256k1_modinv64_modinfo *)0x0;
  sStack_328.modulus.v[4]._0_4_ = 0;
  sStack_328.modulus.v[2] = 0;
  sStack_328.modulus.v[3] = 0;
  sStack_328.modulus.v[0] = 0;
  sStack_328.modulus.v[1] = 0;
  sStack_2f8.v[2] = 0;
  sStack_2f8.v[3] = 0;
  sStack_2f8.v[8] = 0;
  sStack_2f8.v[4] = 0;
  sStack_2f8.v[5] = 0;
  sStack_2f8.v[6] = 0;
  sStack_2f8.v[7] = 0;
  sStack_2f8.v[0] = 1;
  sStack_2f8.v[1] = 0;
  sStack_368.modulus.v[4]._0_4_ = (int32_t)(psVar42->modulus).v[4];
  sStack_368.modulus.v[2] = (psVar42->modulus).v[2];
  sStack_368.modulus.v[3] = (psVar42->modulus).v[3];
  sStack_368.modulus.v[0] = (psVar42->modulus).v[0];
  sStack_368.modulus.v[1] = (psVar42->modulus).v[1];
  sStack_398.modulus.v[4]._0_4_ = (int32_t)(psVar47->modulus).v[4];
  sStack_398.modulus.v[0] = (psVar47->modulus).v[0];
  sStack_398.modulus.v[1] = (psVar47->modulus).v[1];
  sStack_368.modulus_inv62 = (uint64_t)psVar47;
  sStack_398.modulus.v[2] = (psVar47->modulus).v[2];
  sStack_398.modulus.v[3] = (psVar47->modulus).v[3];
  modinfo = (secp256k1_modinv32_modinfo *)0xffffffff;
  psVar36 = (secp256k1_modinv64_modinfo *)0x9;
  puVar37 = secp256k1_modinv32_inv256;
  psStack_338 = psVar42;
  do {
    psVar30 = psStack_338;
    uStack_3ac = (uint)psVar68;
    psVar62 = (secp256k1_modinv32_modinfo *)(sStack_368.modulus.v[0] & 0xffffffff);
    psVar47 = (secp256k1_modinv64_modinfo *)(sStack_398.modulus.v[0] & 0xffffffff);
    uVar13 = 1;
    psVar60 = (secp256k1_modinv64_modinfo *)0x0;
    iVar14 = 0x1e;
    uVar15 = 0;
    psVar40 = (secp256k1_modinv64_modinfo *)0x1;
    uVar58 = (uint)sStack_368.modulus.v[0];
    uVar38 = (uint)sStack_398.modulus.v[0];
    while( true ) {
      uVar26 = -1 << ((byte)iVar14 & 0x1f) | uVar38;
      psVar48 = (secp256k1_modinv64_modinfo *)(ulong)uVar26;
      iVar22 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      bVar20 = (byte)iVar22;
      uVar38 = uVar38 >> (bVar20 & 0x1f);
      uVar39 = (int)psVar40 << (bVar20 & 0x1f);
      psVar40 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
      uVar15 = uVar15 << (bVar20 & 0x1f);
      uVar26 = (int)modinfo - iVar22;
      modinfo = (secp256k1_modinv32_modinfo *)(ulong)uVar26;
      iVar14 = iVar14 - iVar22;
      iVar22 = (int)psVar60;
      psStack_330 = psVar36;
      if (iVar14 == 0) break;
      if ((uVar58 & 1) == 0) {
        pcStack_3c0 = (code *)0x14c341;
        secp256k1_modinv32_var_cold_7();
LAB_0014c341:
        pcStack_3c0 = (code *)0x14c346;
        secp256k1_modinv32_var_cold_6();
LAB_0014c346:
        pcStack_3c0 = (code *)0x14c34b;
        secp256k1_modinv32_var_cold_1();
LAB_0014c34b:
        pcStack_3c0 = (code *)0x14c350;
        secp256k1_modinv32_var_cold_2();
LAB_0014c350:
        pcStack_3c0 = (code *)0x14c355;
        secp256k1_modinv32_var_cold_5();
LAB_0014c355:
        pcStack_3c0 = (code *)0x14c35a;
        secp256k1_modinv32_var_cold_4();
        goto LAB_0014c35a;
      }
      if ((uVar38 & 1) == 0) goto LAB_0014c341;
      uVar21 = uVar15 * (uint)sStack_398.modulus.v[0] + uVar39 * (uint)sStack_368.modulus.v[0];
      psVar48 = (secp256k1_modinv64_modinfo *)(ulong)uVar21;
      bVar20 = 0x1e - (char)iVar14;
      uVar55 = uVar58 << (bVar20 & 0x1f);
      psVar68 = (secp256k1_modinv64_modinfo *)(ulong)uVar55;
      if (uVar21 != uVar55) goto LAB_0014c346;
      uVar55 = uVar13 * (uint)sStack_398.modulus.v[0] + iVar22 * (uint)sStack_368.modulus.v[0];
      psVar68 = (secp256k1_modinv64_modinfo *)(ulong)uVar55;
      uVar21 = uVar38 << (bVar20 & 0x1f);
      psVar48 = (secp256k1_modinv64_modinfo *)(ulong)uVar21;
      if (uVar55 != uVar21) goto LAB_0014c34b;
      if (uVar26 - 0x2f0 < 0xfffffa21) goto LAB_0014c350;
      psVar68 = psVar60;
      if ((int)uVar26 < 0) {
        modinfo = (secp256k1_modinv32_modinfo *)(ulong)-uVar26;
        uVar26 = -uVar58;
        uVar21 = -uVar15;
        psVar40 = psVar60;
        psVar68 = (secp256k1_modinv64_modinfo *)(ulong)-uVar39;
        uVar58 = uVar38;
        uVar38 = uVar26;
        uVar15 = uVar13;
        uVar13 = uVar21;
      }
      psVar48 = (secp256k1_modinv64_modinfo *)(ulong)uVar13;
      iVar22 = (int)modinfo + 1;
      if (iVar14 <= iVar22) {
        iVar22 = iVar14;
      }
      if (iVar22 - 0x1fU < 0xffffffe2) goto LAB_0014c355;
      uVar39 = (uint)(0xff << (-(char)iVar22 & 0x1fU)) >> (-(char)iVar22 & 0x1fU);
      psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uVar39;
      uVar26 = secp256k1_modinv32_inv256[uVar58 >> 1 & 0x7f] * uVar38 & uVar39;
      uVar38 = uVar38 + uVar26 * uVar58;
      psVar60 = (secp256k1_modinv64_modinfo *)(ulong)(uVar26 * (int)psVar40 + (int)psVar68);
      uVar13 = uVar26 * uVar15 + uVar13;
      if ((uVar38 & uVar39) != 0) {
LAB_0014c35a:
        pcStack_3c0 = (code *)0x14c35f;
        secp256k1_modinv32_var_cold_3();
        goto LAB_0014c35f;
      }
    }
    sStack_3a8.u = uVar39;
    sStack_3a8.v = uVar15;
    sStack_3a8.q = iVar22;
    sStack_3a8.r = uVar13;
    if ((long)(int)uVar13 * (long)(int)uVar39 - (long)iVar22 * (long)(int)uVar15 != 0x40000000) {
LAB_0014c35f:
      pcStack_3c0 = (code *)0x14c364;
      secp256k1_modinv32_var_cold_8();
      psVar36 = psVar48;
      psVar30 = psVar42;
LAB_0014c364:
      pcStack_3c0 = (code *)0x14c369;
      secp256k1_modinv32_var_cold_19();
LAB_0014c369:
      pcStack_3c0 = (code *)0x14c36e;
      secp256k1_modinv32_var_cold_18();
LAB_0014c36e:
      pcStack_3c0 = (code *)0x14c373;
      secp256k1_modinv32_var_cold_17();
LAB_0014c373:
      pcStack_3c0 = (code *)0x14c378;
      secp256k1_modinv32_var_cold_16();
LAB_0014c378:
      pcStack_3c0 = (code *)0x14c37d;
      secp256k1_modinv32_var_cold_13();
LAB_0014c37d:
      pcStack_3c0 = (code *)0x14c382;
      secp256k1_modinv32_var_cold_12();
LAB_0014c382:
      pcStack_3c0 = (code *)0x14c387;
      secp256k1_modinv32_var_cold_11();
LAB_0014c387:
      pcStack_3c0 = (code *)0x14c38c;
      secp256k1_modinv32_var_cold_10();
LAB_0014c38c:
      pcStack_3c0 = (code *)0x14c391;
      secp256k1_modinv32_var_cold_9();
      goto LAB_0014c391;
    }
    pcStack_3c0 = (code *)0x14c0c2;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)&sStack_328,&sStack_2f8,&sStack_3a8,
               (secp256k1_modinv32_modinfo *)psStack_338);
    psVar36 = psStack_330;
    psVar40 = &sStack_368;
    iVar22 = (int)psStack_330;
    psVar62 = (secp256k1_modinv32_modinfo *)((ulong)psStack_330 & 0xffffffff);
    pcStack_3c0 = (code *)0x14c0e1;
    psVar47 = psVar40;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar40,iVar22,
                        (secp256k1_modinv32_signed30 *)psVar30,-1);
    if (iVar14 < 1) goto LAB_0014c364;
    psVar62 = (secp256k1_modinv32_modinfo *)((ulong)psVar36 & 0xffffffff);
    pcStack_3c0 = (code *)0x14c0fb;
    psVar47 = psVar40;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar40,iVar22,
                        (secp256k1_modinv32_signed30 *)psVar30,1);
    if (0 < iVar14) goto LAB_0014c369;
    psVar68 = &sStack_398;
    psVar62 = (secp256k1_modinv32_modinfo *)((ulong)psVar36 & 0xffffffff);
    pcStack_3c0 = (code *)0x14c11a;
    psVar47 = psVar68;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar68,iVar22,
                        (secp256k1_modinv32_signed30 *)psVar30,-1);
    if (iVar14 < 1) goto LAB_0014c36e;
    psVar62 = (secp256k1_modinv32_modinfo *)((ulong)psVar36 & 0xffffffff);
    pcStack_3c0 = (code *)0x14c134;
    psVar47 = psVar68;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar68,iVar22,
                        (secp256k1_modinv32_signed30 *)psVar30,1);
    if (-1 < iVar14) goto LAB_0014c373;
    pcStack_3c0 = (code *)0x14c14e;
    secp256k1_modinv32_update_fg_30_var
              (iVar22,(secp256k1_modinv32_signed30 *)psVar40,(secp256k1_modinv32_signed30 *)psVar68,
               &sStack_3a8);
    uVar13 = uStack_3ac;
    psVar68 = (secp256k1_modinv64_modinfo *)(ulong)uStack_3ac;
    if ((uint)sStack_398.modulus.v[0] != 0) {
LAB_0014c15e:
      uVar58 = *(uint *)((long)sStack_368.modulus.v + (long)iVar22 * 4 + -4);
      uVar38 = *(uint *)((long)sStack_398.modulus.v + (long)iVar22 * 4 + -4);
      iVar14 = iVar22 + -2;
      uVar15 = (int)uVar58 >> 0x1f ^ uVar58 | iVar14 >> 0x1f;
      psVar47 = (secp256k1_modinv64_modinfo *)(ulong)uVar15;
      uVar15 = (int)uVar38 >> 0x1f ^ uVar38 | uVar15;
      psVar62 = (secp256k1_modinv32_modinfo *)(ulong)uVar15;
      if (uVar15 == 0) {
        psVar36 = (secp256k1_modinv64_modinfo *)(ulong)(iVar22 - 1);
        puVar2 = (uint *)((long)sStack_368.modulus.v + (long)iVar14 * 4);
        *puVar2 = *puVar2 | uVar58 << 0x1e;
        puVar2 = (uint *)((long)sStack_398.modulus.v + (long)iVar14 * 4);
        *puVar2 = *puVar2 | uVar38 << 0x1e;
      }
      if (0x17 < (int)uStack_3ac) goto LAB_0014c378;
      iVar22 = (int)psVar36;
      psVar62 = (secp256k1_modinv32_modinfo *)((ulong)psVar36 & 0xffffffff);
      pcStack_3c0 = (code *)0x14c1b4;
      psVar47 = psVar40;
      iVar14 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar40,iVar22,
                          (secp256k1_modinv32_signed30 *)psVar30,-1);
      if (iVar14 < 1) goto LAB_0014c37d;
      psVar62 = (secp256k1_modinv32_modinfo *)((ulong)psVar36 & 0xffffffff);
      pcStack_3c0 = (code *)0x14c1ce;
      psVar47 = psVar40;
      iVar14 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar40,iVar22,
                          (secp256k1_modinv32_signed30 *)psVar30,1);
      if (0 < iVar14) goto LAB_0014c382;
      psVar40 = &sStack_398;
      psVar62 = (secp256k1_modinv32_modinfo *)((ulong)psVar36 & 0xffffffff);
      pcStack_3c0 = (code *)0x14c1ed;
      psVar47 = psVar40;
      iVar14 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar40,iVar22,
                          (secp256k1_modinv32_signed30 *)psVar30,-1);
      if (iVar14 < 1) goto LAB_0014c387;
      psVar62 = (secp256k1_modinv32_modinfo *)((ulong)psVar36 & 0xffffffff);
      pcStack_3c0 = (code *)0x14c207;
      psVar47 = psVar40;
      iVar14 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar40,iVar22,
                          (secp256k1_modinv32_signed30 *)psVar30,1);
      if (iVar14 < 0) {
        psVar68 = (secp256k1_modinv64_modinfo *)(ulong)(uVar13 + 1);
        uVar58 = 1;
        goto LAB_0014c23a;
      }
      goto LAB_0014c38c;
    }
    uVar58 = 0;
    if (1 < iVar22) {
      uVar51 = 1;
      do {
        uVar58 = uVar58 | *(uint *)((long)sStack_398.modulus.v + uVar51 * 4);
        uVar51 = uVar51 + 1;
      } while (((ulong)psVar36 & 0xffffffff) != uVar51);
      if (uVar58 != 0) goto LAB_0014c15e;
      uVar58 = 0;
    }
LAB_0014c23a:
    psVar42 = psVar30;
  } while ((char)uVar58 != '\0');
  psVar47 = &sStack_398;
  iVar22 = (int)psVar36;
  psVar62 = (secp256k1_modinv32_modinfo *)((ulong)psVar36 & 0xffffffff);
  pcStack_3c0 = (code *)0x14c257;
  iVar14 = secp256k1_modinv32_mul_cmp_30
                     ((secp256k1_modinv32_signed30 *)psVar47,iVar22,&SECP256K1_SIGNED30_ONE,0);
  if (iVar14 == 0) {
    pcStack_3c0 = (code *)0x14c277;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_368,iVar22,&SECP256K1_SIGNED30_ONE,-1
                       );
    psVar68 = (secp256k1_modinv64_modinfo *)sStack_368.modulus_inv62;
    if (iVar14 == 0) {
LAB_0014c2f9:
      pcStack_3c0 = (code *)0x14c313;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)&sStack_328,
                 *(int32_t *)((long)sStack_368.modulus.v + (long)iVar22 * 4 + -4),
                 (secp256k1_modinv32_modinfo *)psVar30);
      *(int32_t *)((psVar68->modulus).v + 4) = (int32_t)sStack_328.modulus.v[4];
      (psVar68->modulus).v[2] = sStack_328.modulus.v[2];
      (psVar68->modulus).v[3] = sStack_328.modulus.v[3];
      (psVar68->modulus).v[0] = sStack_328.modulus.v[0];
      (psVar68->modulus).v[1] = sStack_328.modulus.v[1];
      return;
    }
    pcStack_3c0 = (code *)0x14c298;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_368,iVar22,&SECP256K1_SIGNED30_ONE,1)
    ;
    if (iVar14 == 0) goto LAB_0014c2f9;
    psVar62 = (secp256k1_modinv32_modinfo *)0x9;
    pcStack_3c0 = (code *)0x14c2b2;
    psVar47 = psVar68;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar68,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar14 == 0) {
      psVar47 = &sStack_328;
      psVar62 = (secp256k1_modinv32_modinfo *)0x9;
      pcStack_3c0 = (code *)0x14c2d5;
      iVar14 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar47,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar14 == 0) {
        psVar47 = &sStack_368;
        psVar62 = (secp256k1_modinv32_modinfo *)((ulong)psVar36 & 0xffffffff);
        pcStack_3c0 = (code *)0x14c2f1;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar47,iVar22,
                            (secp256k1_modinv32_signed30 *)psVar30,1);
        if (iVar14 == 0) goto LAB_0014c2f9;
      }
    }
  }
  else {
LAB_0014c391:
    pcStack_3c0 = (code *)0x14c396;
    secp256k1_modinv32_var_cold_14();
  }
  pcStack_3c0 = secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  pcStack_3c0 = (code *)secp256k1_modinv32_inv256;
  psStack_3c8 = psVar30;
  psStack_3d0 = psVar68;
  psStack_3d8 = psVar40;
  psStack_3e0 = modinfo;
  psStack_3e8 = psVar36;
  uVar13 = 0;
  sStack_440.modulus.v[4]._0_4_ = 0;
  sStack_440.modulus.v[2] = 0;
  sStack_440.modulus.v[3] = 0;
  sStack_440.modulus.v[0] = 0;
  sStack_440.modulus.v[1] = 0;
  sStack_410.v[2] = 0;
  sStack_410.v[3] = 0;
  sStack_410.v[8] = 0;
  sStack_410.v[4] = 0;
  sStack_410.v[5] = 0;
  sStack_410.v[6] = 0;
  sStack_410.v[7] = 0;
  sStack_410.v[0] = 1;
  sStack_410.v[1] = 0;
  sStack_4c0.modulus.v[4]._0_4_ = (psVar62->modulus).v[8];
  sStack_4c0.modulus.v[2] = *(int64_t *)((psVar62->modulus).v + 4);
  sStack_4c0.modulus.v[3] = *(int64_t *)((psVar62->modulus).v + 6);
  sStack_4c0.modulus.v[0] = *(int64_t *)(psVar62->modulus).v;
  sStack_4c0.modulus.v[1] = *(int64_t *)((psVar62->modulus).v + 2);
  sStack_480.modulus.v[4]._0_4_ = (int32_t)(psVar47->modulus).v[4];
  sStack_480.modulus.v[0] = (psVar47->modulus).v[0];
  sStack_480.modulus.v[1] = (psVar47->modulus).v[1];
  psStack_450 = psVar47;
  sStack_480.modulus.v[2] = (psVar47->modulus).v[2];
  sStack_480.modulus.v[3] = (psVar47->modulus).v[3];
  uVar51 = 0xffffffff;
  psStack_4d8 = psVar62;
  do {
    lStack_448 = (long)(int)(uint)sStack_4c0.modulus.v[0];
    uVar52 = (ulong)(int)(uint)sStack_480.modulus.v[0];
    uVar41 = 0;
    psVar40 = (secp256k1_modinv64_modinfo *)0x1;
    uVar58 = 0;
    uVar26 = 0;
    uVar39 = 1;
    uVar38 = (uint)sStack_480.modulus.v[0];
    uVar15 = (uint)sStack_4c0.modulus.v[0];
    do {
      uVar21 = (uint)sStack_4c0.modulus.v[0];
      uStack_4cc = uVar13;
      if ((uVar15 & 1) == 0) {
        psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c852;
        secp256k1_modinv32_cold_17();
LAB_0014c852:
        psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c857;
        secp256k1_modinv32_cold_1();
LAB_0014c857:
        psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c85c;
        secp256k1_modinv32_cold_2();
        psVar62 = modinfo;
LAB_0014c85c:
        psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c861;
        secp256k1_modinv32_cold_16();
        goto LAB_0014c861;
      }
      uVar59 = (uint)psVar40;
      uVar34 = uVar58 * (uint)sStack_480.modulus.v[0] + uVar59 * (uint)sStack_4c0.modulus.v[0];
      puVar37 = (uint8_t *)(ulong)uVar34;
      uVar55 = uVar15 << ((byte)uVar41 & 0x1f);
      psVar36 = (secp256k1_modinv64_modinfo *)(ulong)uVar55;
      if (uVar34 != uVar55) goto LAB_0014c852;
      uVar34 = uVar39 * (uint)sStack_480.modulus.v[0] + uVar26 * (uint)sStack_4c0.modulus.v[0];
      puVar37 = (uint8_t *)(ulong)uVar34;
      uVar55 = uVar38 << ((byte)uVar41 & 0x1f);
      psVar36 = (secp256k1_modinv64_modinfo *)(ulong)uVar55;
      if (uVar34 != uVar55) goto LAB_0014c857;
      uStack_4c4 = (int)(uint)uVar51 >> 0x1f;
      puVar37 = (uint8_t *)(ulong)uStack_4c4;
      uStack_4c8 = uVar38 & 1;
      uVar55 = -uStack_4c8;
      psVar68 = (secp256k1_modinv64_modinfo *)(ulong)uVar55;
      uVar34 = uStack_4c4 & uVar55;
      psVar36 = (secp256k1_modinv64_modinfo *)(ulong)uVar34;
      uVar64 = (uint)uVar51 ^ uVar34;
      uVar51 = (ulong)uVar64;
      psVar62 = (secp256k1_modinv32_modinfo *)(ulong)(uVar64 - 0x25b);
      if (uVar64 - 0x25b < 0xfffffb4d) goto LAB_0014c85c;
      uVar51 = (ulong)(uVar64 - 1);
      uVar39 = uVar39 + ((uStack_4c4 ^ uVar58) - uStack_4c4 & uVar55);
      uVar58 = (uVar58 + (uVar39 & uVar34)) * 2;
      uVar26 = uVar26 + ((uStack_4c4 ^ uVar59) - uStack_4c4 & uVar55);
      uVar59 = (uVar59 + (uVar26 & uVar34)) * 2;
      psVar40 = (secp256k1_modinv64_modinfo *)(ulong)uVar59;
      uVar55 = ((uStack_4c4 ^ uVar15) - uStack_4c4 & uVar55) + uVar38;
      uVar38 = uVar55 >> 1;
      uVar55 = uVar55 & uVar34;
      modinfo = (secp256k1_modinv32_modinfo *)(ulong)uVar55;
      uVar15 = uVar15 + uVar55;
      uVar55 = (int)uVar41 + 1;
      uVar41 = (ulong)uVar55;
    } while (uVar55 != 0x1e);
    psVar36 = (secp256k1_modinv64_modinfo *)(long)(int)uVar59;
    psVar68 = (secp256k1_modinv64_modinfo *)(long)(int)uVar39;
    puVar37 = (uint8_t *)(long)(int)uVar58;
    psVar62 = (secp256k1_modinv32_modinfo *)(long)(int)uVar26;
    uVar41 = (long)psVar36 * (long)psVar68 - (long)puVar37 * (long)psVar62;
    sStack_490.u = uVar59;
    sStack_490.v = uVar58;
    sStack_490.q = uVar26;
    sStack_490.r = uVar39;
    if (uVar41 != 0x40000000) {
LAB_0014c861:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c866;
      secp256k1_modinv32_cold_3();
LAB_0014c866:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c86b;
      secp256k1_modinv32_cold_15();
LAB_0014c86b:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c870;
      secp256k1_modinv32_cold_14();
LAB_0014c870:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c875;
      secp256k1_modinv32_cold_13();
LAB_0014c875:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c87a;
      secp256k1_modinv32_cold_12();
LAB_0014c87a:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c87f;
      secp256k1_modinv32_cold_4();
LAB_0014c87f:
      modinfo = psVar62;
      uVar13 = (uint)uVar41;
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c884;
      secp256k1_modinv32_cold_5();
LAB_0014c884:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c889;
      secp256k1_modinv32_cold_11();
LAB_0014c889:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c88e;
      secp256k1_modinv32_cold_10();
LAB_0014c88e:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c893;
      secp256k1_modinv32_cold_9();
LAB_0014c893:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c898;
      secp256k1_modinv32_cold_8();
      goto LAB_0014c898;
    }
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c584;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)&sStack_440,&sStack_410,&sStack_490,psStack_4d8);
    psVar40 = &sStack_4c0;
    uVar21 = 9;
    uVar41 = 0xffffffff;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c59d;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar40,9,&psStack_4d8->modulus,-1);
    if (iVar14 < 1) goto LAB_0014c866;
    psVar40 = &sStack_4c0;
    uVar21 = 9;
    uVar41 = 1;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c5be;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar40,9,&psStack_4d8->modulus,1);
    if (0 < iVar14) goto LAB_0014c86b;
    psVar40 = &sStack_480;
    uVar21 = 9;
    uVar41 = 0xffffffff;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c5df;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar40,9,&psStack_4d8->modulus,-1);
    if (iVar14 < 1) goto LAB_0014c870;
    psVar40 = &sStack_480;
    uVar21 = 9;
    uVar41 = 1;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c600;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar40,9,&psStack_4d8->modulus,1);
    modinfo = psStack_4d8;
    if (-1 < iVar14) goto LAB_0014c875;
    uVar41 = (long)psVar36 * lStack_448;
    uVar19 = (long)puVar37 * uVar52 + uVar41;
    if ((uVar19 & 0x3ffffffe) != 0) goto LAB_0014c87a;
    uVar52 = uVar52 * (long)psVar68 + lStack_448 * (long)psVar62;
    if ((uVar52 & 0x3fffffff) != 0) goto LAB_0014c87f;
    uVar52 = (long)uVar52 >> 0x1e;
    lVar18 = (long)uVar19 >> 0x1e;
    lVar28 = 1;
    do {
      lVar24 = (long)*(int *)((long)sStack_4c0.modulus.v + lVar28 * 4);
      lVar43 = (long)*(int *)((long)sStack_480.modulus.v + lVar28 * 4);
      lVar18 = lVar43 * (long)puVar37 + lVar24 * (long)psVar36 + lVar18;
      lVar24 = lVar43 * (long)psVar68 + lVar24 * (long)psVar62 + uVar52;
      (&uStack_4c4)[lVar28] = (uint)lVar18 & 0x3fffffff;
      *(uint *)((long)sStack_480.modulus.v + lVar28 * 4 + -4) = (uint)lVar24 & 0x3fffffff;
      lVar28 = lVar28 + 1;
      uVar52 = lVar24 >> 0x1e;
      lVar18 = lVar18 >> 0x1e;
    } while (lVar28 != 9);
    sStack_4c0.modulus.v[4]._0_4_ = (int32_t)lVar18;
    sStack_480.modulus.v[4]._0_4_ = (int32_t)uVar52;
    psVar36 = &sStack_4c0;
    uVar21 = 9;
    uVar13 = 0xffffffff;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c6d4;
    psVar40 = psVar36;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar36,9,&psStack_4d8->modulus,-1);
    if (iVar14 < 1) goto LAB_0014c884;
    uVar21 = 9;
    uVar13 = 1;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c6f1;
    psVar40 = psVar36;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar36,9,&modinfo->modulus,1);
    if (0 < iVar14) goto LAB_0014c889;
    psVar36 = &sStack_480;
    uVar21 = 9;
    uVar13 = 0xffffffff;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c713;
    psVar40 = psVar36;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar36,9,&modinfo->modulus,-1);
    if (iVar14 < 1) goto LAB_0014c88e;
    uVar21 = 9;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c730;
    psVar40 = psVar36;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar36,9,&modinfo->modulus,1);
    uVar13 = uStack_4cc;
    if (-1 < iVar14) goto LAB_0014c893;
    uVar13 = uStack_4cc + 1;
  } while (uVar13 != 0x14);
  psVar40 = &sStack_480;
  uVar21 = 9;
  uVar13 = 0;
  psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c75f;
  iVar14 = secp256k1_modinv32_mul_cmp_30
                     ((secp256k1_modinv32_signed30 *)psVar40,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar14 == 0) {
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c782;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_4c0,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar68 = psStack_450;
    if (iVar14 == 0) {
LAB_0014c80d:
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c824;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)&sStack_440,(int32_t)sStack_4c0.modulus.v[4],modinfo
                );
      *(int32_t *)((psVar68->modulus).v + 4) = (int32_t)sStack_440.modulus.v[4];
      (psVar68->modulus).v[2] = sStack_440.modulus.v[2];
      (psVar68->modulus).v[3] = sStack_440.modulus.v[3];
      (psVar68->modulus).v[0] = sStack_440.modulus.v[0];
      (psVar68->modulus).v[1] = sStack_440.modulus.v[1];
      return;
    }
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c7a9;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_4c0,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar14 == 0) goto LAB_0014c80d;
    uVar21 = 9;
    uVar13 = 0;
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c7c3;
    psVar40 = psVar68;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar68,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar14 == 0) {
      psVar40 = &sStack_440;
      uVar21 = 9;
      uVar13 = 0;
      psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c7e6;
      iVar14 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar40,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar14 == 0) {
        psVar40 = &sStack_4c0;
        uVar21 = 9;
        uVar13 = 1;
        psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c805;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar40,9,&modinfo->modulus,1);
        if (iVar14 == 0) goto LAB_0014c80d;
      }
    }
  }
  else {
LAB_0014c898:
    psStack_4e8 = (secp256k1_modinv64_modinfo *)0x14c89d;
    secp256k1_modinv32_cold_6();
  }
  psStack_4e8 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_538;
  piVar31 = (int *)(ulong)uVar13;
  pcStack_540 = (code *)0x14c8c2;
  psStack_4f0 = psVar36;
  psStack_4e8 = psVar68;
  secp256k1_modinv32_mul_30(&sStack_514,(secp256k1_modinv32_signed30 *)psVar40,uVar21,1);
  pcStack_540 = (code *)0x14c8d4;
  piVar57 = piVar31;
  psVar44 = a_00;
  secp256k1_modinv32_mul_30(&sStack_538,a_00,9,uVar13);
  lVar18 = 0;
  while ((uint)sStack_514.v[lVar18] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_538.v[lVar18]) goto LAB_0014c926;
    lVar18 = lVar18 + 1;
    if (lVar18 == 8) {
      uVar13 = 8;
      while( true ) {
        if (sStack_514.v[uVar13] < sStack_538.v[uVar13]) {
          return;
        }
        if (sStack_538.v[uVar13] < sStack_514.v[uVar13]) break;
        bVar70 = uVar13 == 0;
        uVar13 = uVar13 - 1;
        if (bVar70) {
          return;
        }
      }
      return;
    }
  }
  pcStack_540 = (code *)0x14c926;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_0014c926:
  pcStack_540 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar14 = (int)a_01;
  piStack_568 = piVar31;
  psStack_560 = modinfo;
  uStack_558 = uVar52;
  uStack_548 = uVar51;
  pcStack_540 = (code *)puVar37;
  if (iVar14 < 1) {
    psStack_578 = (secp256k1_modinv32_signed30 *)0x14ca19;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_0014ca19:
    iVar23 = (int)piVar57;
    psStack_578 = (secp256k1_modinv32_signed30 *)0x14ca1e;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar22 = piVar57[1];
    iVar54 = *piVar57;
    piVar31 = (int *)(long)psVar44->v[0];
    uVar41 = (long)*extraout_RDX * (long)iVar22 + (long)piVar31 * (long)iVar54;
    if ((uVar41 & 0x3fffffff) != 0) goto LAB_0014ca19;
    iVar5 = piVar57[3];
    iVar23 = piVar57[2];
    piVar31 = (int *)((long)piVar31 * (long)iVar23);
    piVar57 = (int *)((long)*extraout_RDX * (long)iVar5 + (long)piVar31);
    if (((ulong)piVar57 & 0x3fffffff) == 0) {
      lVar28 = (long)piVar57 >> 0x1e;
      lVar18 = (long)uVar41 >> 0x1e;
      if (iVar14 != 1) {
        uVar51 = 1;
        do {
          lVar18 = (long)extraout_RDX[uVar51] * (long)iVar22 +
                   (long)psVar44->v[uVar51] * (long)iVar54 + lVar18;
          lVar28 = (long)extraout_RDX[uVar51] * (long)iVar5 +
                   (long)psVar44->v[uVar51] * (long)iVar23 + lVar28;
          psVar44->v[uVar51 - 1] = (uint)lVar18 & 0x3fffffff;
          extraout_RDX[uVar51 - 1] = (uint)lVar28 & 0x3fffffff;
          uVar51 = uVar51 + 1;
          lVar28 = lVar28 >> 0x1e;
          lVar18 = lVar18 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar51);
      }
      psVar44->v[(long)iVar14 + -1] = (int32_t)lVar18;
      extraout_RDX[(long)iVar14 + -1] = (int)lVar28;
      return;
    }
  }
  psStack_578 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar18 = 0;
  psStack_578 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar18 < extraout_EDX) {
      psStack_578 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_578->v + (long)psVar44->v[lVar18] * (long)iVar23);
    }
    a_01->v[lVar18] = (uint)psStack_578 & 0x3fffffff;
    psStack_578 = (secp256k1_modinv32_signed30 *)((long)psStack_578 >> 0x1e);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 8);
  if (8 < extraout_EDX) {
    psStack_578 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_578->v + (long)psVar44->v[8] * (long)iVar23);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_578;
  if (b == psStack_578) {
    a_01->v[8] = (int)psStack_578;
    return;
  }
  pcStack_580 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar13 = *extraout_RDX_00;
  psVar65 = (secp256k1_modinv32_signed30 *)(long)(int)uVar13;
  uVar58 = extraout_RDX_00[1];
  lVar18 = (long)(int)uVar58;
  uVar38 = extraout_RDX_00[2];
  psVar32 = (secp256k1_modinv32_signed30 *)(long)(int)uVar38;
  lStack_5b8 = (long)(int)extraout_RDX_00[3];
  psVar45 = (secp256k1_fe *)0x9;
  pcStack_5c8 = (code *)0x14cab8;
  a_02 = a_01;
  piStack_5a8 = piVar31;
  psStack_5a0 = modinfo;
  uStack_598 = uVar52;
  uStack_588 = uVar51;
  pcStack_580 = (code *)puVar37;
  iVar14 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar14 < 1) {
    pcStack_5c8 = (code *)0x14cd20;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014cd20:
    pcStack_5c8 = (code *)0x14cd25;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014cd25:
    pcStack_5c8 = (code *)0x14cd2a;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014cd2a:
    pcStack_5c8 = (code *)0x14cd2f;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014cd2f:
    pcStack_5c8 = (code *)0x14cd34;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014cd34:
    pcStack_5c8 = (code *)0x14cd39;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014cd39:
    pcStack_5c8 = (code *)0x14cd3e;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014cd3e:
    pcStack_5c8 = (code *)0x14cd43;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar63 = b;
LAB_0014cd43:
    pcStack_5c8 = (code *)0x14cd48;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014cd48:
    pcStack_5c8 = (code *)0x14cd4d;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014cd4d:
    pcStack_5c8 = (code *)0x14cd52;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x14cad5;
    a_02 = a_01;
    iVar14 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar14) goto LAB_0014cd20;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x14caf2;
    a_02 = psVar44;
    iVar14 = secp256k1_modinv32_mul_cmp_30(psVar44,9,b,-2);
    if (iVar14 < 1) goto LAB_0014cd25;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x14cb0f;
    a_02 = psVar44;
    iVar14 = secp256k1_modinv32_mul_cmp_30(psVar44,9,b,1);
    if (-1 < iVar14) goto LAB_0014cd2a;
    psVar63 = (secp256k1_modinv32_signed30 *)-(long)psVar65;
    if (0 < (long)psVar65) {
      psVar63 = psVar65;
    }
    lVar28 = -lVar18;
    if (lVar18 < 1) {
      lVar28 = lVar18;
    }
    if (lVar28 + 0x40000000 < (long)psVar63) goto LAB_0014cd2f;
    psVar63 = (secp256k1_modinv32_signed30 *)-(long)psVar32;
    if (0 < (long)psVar32) {
      psVar63 = psVar32;
    }
    lVar28 = -lStack_5b8;
    if (lStack_5b8 < 1) {
      lVar28 = lStack_5b8;
    }
    if (lVar28 + 0x40000000 < (long)psVar63) goto LAB_0014cd34;
    uVar26 = a_01->v[8] >> 0x1f;
    uVar15 = psVar44->v[8] >> 0x1f;
    psVar45 = (secp256k1_fe *)(ulong)uVar15;
    iVar14 = (uVar15 & uVar58) + (uVar26 & uVar13);
    a_02 = (secp256k1_modinv32_signed30 *)
           (psVar44->v[0] * lVar18 + (long)a_01->v[0] * (long)psVar65);
    lVar28 = (long)(int)(iVar14 - ((int)a_02 * b[1].v[0] + iVar14 & 0x3fffffffU));
    piVar25 = (int32_t *)((long)a_02->v + lVar28 * b->v[0]);
    if (((ulong)piVar25 & 0x3fffffff) != 0) goto LAB_0014cd39;
    lStack_5b0 = lVar28;
    iVar14 = (uVar15 & (uint)lStack_5b8) + (uVar26 & uVar38);
    lVar24 = psVar44->v[0] * lStack_5b8 + (long)a_01->v[0] * (long)psVar32;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar13 = iVar14 - (b[1].v[0] * (int)lVar24 + iVar14 & 0x3fffffffU);
    psVar45 = (secp256k1_fe *)(ulong)uVar13;
    uVar51 = (long)b->v[0] * (long)(int)uVar13 + lVar24;
    if ((uVar51 & 0x3fffffff) != 0) goto LAB_0014cd3e;
    lVar24 = (long)uVar51 >> 0x1e;
    lVar43 = (long)piVar25 >> 0x1e;
    lVar49 = 1;
    do {
      lVar43 = b->v[lVar49] * lVar28 + psVar44->v[lVar49] * lVar18 +
               (long)a_01->v[lVar49] * (long)psVar65 + lVar43;
      psVar63 = (secp256k1_modinv32_signed30 *)(psVar44->v[lVar49] * lStack_5b8);
      lVar24 = (long)psVar63->v +
               (long)a_01->v[lVar49] * (long)psVar32 + lVar24 +
               (long)b->v[lVar49] * (long)(int)uVar13;
      a_01->v[lVar49 + -1] = (uint)lVar43 & 0x3fffffff;
      psVar44->v[lVar49 + -1] = (uint)lVar24 & 0x3fffffff;
      lVar49 = lVar49 + 1;
      lVar24 = lVar24 >> 0x1e;
      lVar43 = lVar43 >> 0x1e;
    } while (lVar49 != 9);
    a_01->v[8] = (int32_t)lVar43;
    psVar44->v[8] = (int32_t)lVar24;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x14ccb9;
    a_02 = a_01;
    iVar14 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar32 = psVar44;
    psVar65 = b;
    if (iVar14 < 1) goto LAB_0014cd43;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x14ccd6;
    a_02 = a_01;
    iVar14 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar14) goto LAB_0014cd48;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x14ccef;
    a_02 = psVar44;
    iVar14 = secp256k1_modinv32_mul_cmp_30(psVar44,9,b,-2);
    if (iVar14 < 1) goto LAB_0014cd4d;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_5c8 = (code *)0x14cd08;
    a_02 = psVar44;
    iVar14 = secp256k1_modinv32_mul_cmp_30(psVar44,9,b,1);
    if (iVar14 < 0) {
      return;
    }
  }
  pcStack_5c8 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_5c8 = (code *)lVar18;
  psStack_5d0 = a_01;
  psStack_5d8 = psVar44;
  psStack_5e0 = psVar65;
  psStack_5e8 = psVar63;
  psStack_5f0 = psVar32;
  uVar13 = a_02->v[0];
  uVar50 = (ulong)uVar13;
  uVar58 = a_02->v[3];
  uVar19 = (ulong)uVar58;
  uVar38 = a_02->v[4];
  uVar41 = (ulong)uVar38;
  uVar15 = a_02->v[5];
  uVar52 = (ulong)uVar15;
  psVar44 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar26 = a_02->v[7];
  uVar51 = (ulong)uVar26;
  iStack_5f4 = a_02->v[8];
  lVar18 = 0;
  do {
    if (a_02->v[lVar18] < -0x3fffffff) {
      pcStack_630 = (code *)0x14d0a0;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014d0a0:
      pcStack_630 = (code *)0x14d0a5;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014d0a5;
    }
    if (0x3fffffff < a_02->v[lVar18]) goto LAB_0014d0a0;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 9);
  uStack_614 = (uint)psVar45;
  psVar45 = (secp256k1_fe *)0x9;
  pcStack_630 = (code *)0x14cddd;
  psVar44 = a_02;
  uStack_620 = a_02->v[1];
  uStack_61c = a_02->v[2];
  uStack_618 = a_02->v[6];
  psStack_610 = b_00;
  iVar14 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar14 < 1) {
LAB_0014d0a5:
    pcStack_630 = (code *)0x14d0aa;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014d0aa:
    pcStack_630 = (code *)0x14d0af;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014d0af:
    pcStack_630 = (code *)0x14d0b4;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014d0b4:
    pcStack_630 = (code *)0x14d0b9;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_630 = (code *)0x14cdfc;
    psVar44 = a_02;
    iVar14 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_610,1);
    if (-1 < iVar14) goto LAB_0014d0aa;
    uVar39 = iStack_5f4 >> 0x1f;
    uStack_5f8 = psStack_610->v[1];
    uVar21 = (uVar39 & uStack_5f8) + uStack_620;
    uStack_620 = psStack_610->v[2];
    uVar55 = (uVar39 & uStack_620) + uStack_61c;
    uStack_61c = psStack_610->v[3];
    uStack_5fc = psStack_610->v[4];
    uStack_600 = psStack_610->v[5];
    uStack_604 = psStack_610->v[6];
    uVar64 = (uVar39 & uStack_604) + uStack_618;
    uStack_618 = psStack_610->v[7];
    uStack_624 = (int)uStack_614 >> 0x1f;
    uStack_614 = psStack_610->v[8];
    uVar59 = ((uVar39 & psStack_610->v[0]) + uVar13 ^ uStack_624) - uStack_624;
    uVar34 = ((int)uVar59 >> 0x1e) + ((uVar21 ^ uStack_624) - uStack_624);
    uVar21 = ((int)uVar34 >> 0x1e) + ((uVar55 ^ uStack_624) - uStack_624);
    uVar66 = ((int)uVar21 >> 0x1e) + (((uVar39 & uStack_61c) + uVar58 ^ uStack_624) - uStack_624);
    uVar58 = ((int)uVar66 >> 0x1e) + (((uVar39 & uStack_5fc) + uVar38 ^ uStack_624) - uStack_624);
    uVar13 = ((int)uVar58 >> 0x1e) + (((uVar39 & uStack_600) + uVar15 ^ uStack_624) - uStack_624);
    uVar38 = ((int)uVar13 >> 0x1e) + ((uVar64 ^ uStack_624) - uStack_624);
    uVar15 = ((int)uVar38 >> 0x1e) + (((uVar39 & uStack_618) + uVar26 ^ uStack_624) - uStack_624);
    uVar35 = ((int)uVar15 >> 0x1e) +
             (((uVar39 & uStack_614) + iStack_5f4 ^ uStack_624) - uStack_624);
    uVar52 = (ulong)uVar35;
    uStack_628 = (int)uVar35 >> 0x1f;
    uVar64 = (psStack_610->v[0] & uStack_628) + (uVar59 & 0x3fffffff);
    uVar55 = (uStack_600 & uStack_628) + (uVar13 & 0x3fffffff);
    uVar50 = (ulong)uVar55;
    uVar59 = (uStack_604 & uStack_628) + (uVar38 & 0x3fffffff);
    uVar19 = (ulong)uVar59;
    uVar13 = ((int)uVar64 >> 0x1e) + (uStack_5f8 & uStack_628) + (uVar34 & 0x3fffffff);
    uVar38 = ((int)uVar13 >> 0x1e) + (uStack_620 & uStack_628) + (uVar21 & 0x3fffffff);
    uVar26 = ((int)uVar38 >> 0x1e) + (uStack_61c & uStack_628) + (uVar66 & 0x3fffffff);
    uVar39 = ((int)uVar26 >> 0x1e) + (uStack_5fc & uStack_628) + (uVar58 & 0x3fffffff);
    uVar55 = ((int)uVar39 >> 0x1e) + uVar55;
    uVar59 = ((int)uVar55 >> 0x1e) + uVar59;
    uVar58 = ((int)uVar59 >> 0x1e) + (uStack_618 & uStack_628) + (uVar15 & 0x3fffffff);
    uVar15 = ((int)uVar58 >> 0x1e) + (uStack_614 & uStack_628) + uVar35;
    uVar41 = (ulong)uVar15;
    uVar26 = uVar26 & 0x3fffffff;
    psVar45 = (secp256k1_fe *)(ulong)uVar26;
    uVar39 = uVar39 & 0x3fffffff;
    psVar44 = (secp256k1_modinv32_signed30 *)(ulong)uVar39;
    uVar58 = uVar58 & 0x3fffffff;
    uVar51 = (ulong)uVar58;
    a_02->v[0] = uVar64 & 0x3fffffff;
    a_02->v[1] = uVar13 & 0x3fffffff;
    a_02->v[2] = uVar38 & 0x3fffffff;
    a_02->v[3] = uVar26;
    a_02->v[4] = uVar39;
    a_02->v[5] = uVar55 & 0x3fffffff;
    a_02->v[6] = uVar59 & 0x3fffffff;
    a_02->v[7] = uVar58;
    a_02->v[8] = uVar15;
    if (0x3fffffff < uVar15) goto LAB_0014d0af;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_630 = (code *)0x14d06d;
    psVar44 = a_02;
    iVar14 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_610,0);
    if (iVar14 < 0) goto LAB_0014d0b4;
    psVar45 = (secp256k1_fe *)0x9;
    pcStack_630 = (code *)0x14d088;
    psVar44 = a_02;
    iVar14 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_610,1);
    if (iVar14 < 0) {
      return;
    }
  }
  pcStack_630 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  r = &sStack_6f0;
  psVar33 = &sStack_6f0;
  pcVar29 = secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    pcVar29 = secp256k1_fe_inv;
  }
  pcStack_6f8 = (code *)0x14d0ef;
  uStack_658 = uVar51;
  uStack_650 = uVar52;
  uStack_648 = uVar19;
  psStack_640 = a_02;
  uStack_638 = uVar50;
  pcStack_630 = (code *)uVar41;
  (*pcVar29)(&sStack_6f0);
  if (psVar44 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar44->v + 8) = sStack_6f0.n[4];
    *(ulong *)(psVar44[1].v + 1) = CONCAT44(sStack_6f0.normalized,sStack_6f0.magnitude);
    *(uint64_t *)(psVar44->v + 4) = sStack_6f0.n[2];
    *(uint64_t *)(psVar44->v + 6) = sStack_6f0.n[3];
    *(uint64_t *)psVar44->v = sStack_6f0.n[0];
    *(uint64_t *)(psVar44->v + 2) = sStack_6f0.n[1];
  }
  uVar41 = 0xffffffffffff;
  sStack_690.n[0] = psVar45->n[0];
  sStack_690.n[1] = psVar45->n[1];
  sStack_690.n[2] = psVar45->n[2];
  sStack_690.n[3] = psVar45->n[3];
  sStack_690.n[4] = psVar45->n[4];
  sStack_690.magnitude = psVar45->magnitude;
  sStack_690.normalized = psVar45->normalized;
  psVar46 = &sStack_690;
  pcStack_6f8 = (code *)0x14d158;
  secp256k1_fe_verify(psVar46);
  uVar51 = (sStack_690.n[4] >> 0x30) * 0x1000003d1 + sStack_690.n[0];
  if (((uVar51 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar51 & 0xfffffffffffff) == 0)) {
    uVar52 = (uVar51 >> 0x34) + sStack_690.n[1];
    uVar19 = (uVar52 >> 0x34) + sStack_690.n[2];
    uVar50 = (uVar19 >> 0x34) + sStack_690.n[3];
    uVar53 = (uVar50 >> 0x34) + (sStack_690.n[4] & 0xffffffffffff);
    if ((((uVar52 | uVar51 | uVar19 | uVar50) & 0xfffffffffffff) != 0 || uVar53 != 0) &&
       (((uVar51 | 0x1000003d0) & uVar52 & uVar19 & uVar50 & (uVar53 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014d1ff;
LAB_0014d5c9:
    pcStack_6f8 = (code *)0x14d5d4;
    secp256k1_fe_verify(&sStack_6f0);
    uVar41 = sStack_6f0.n[4] & 0xffffffffffff;
    uVar51 = (sStack_6f0.n[4] >> 0x30) * 0x1000003d1 + sStack_6f0.n[0];
    uVar52 = (uVar51 >> 0x34) + sStack_6f0.n[1];
    uVar19 = (uVar52 >> 0x34) + sStack_6f0.n[2];
    r = (secp256k1_fe *)((uVar19 >> 0x34) + sStack_6f0.n[3]);
    uVar50 = ((ulong)r >> 0x34) + uVar41;
    if ((((uVar52 | uVar51 | uVar19 | (ulong)r) & 0xfffffffffffff) == 0 && uVar50 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar50 ^ 0xf000000000000), psVar33 = &sStack_6f0,
       ((uVar51 ^ 0x1000003d0) & uVar52 & uVar19 & (ulong)r & (ulong)r_00) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_0014d1ff:
    pcStack_6f8 = (code *)0x14d212;
    psVar46 = psVar45;
    secp256k1_fe_mul(&sStack_690,psVar45,&sStack_6f0);
    pcStack_6f8 = (code *)0x14d21a;
    secp256k1_fe_verify(&sStack_690);
    r_00 = &fe_minus_one;
    pcStack_6f8 = (code *)0x14d226;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_690.magnitude < 0x20) {
      sStack_690.n[0] = sStack_690.n[0] + 0xffffefffffc2e;
      sStack_690.n[1] = sStack_690.n[1] + 0xfffffffffffff;
      sStack_690.n[2] = sStack_690.n[2] + 0xfffffffffffff;
      sStack_690.n[3] = sStack_690.n[3] + 0xfffffffffffff;
      sStack_690.n[4] = sStack_690.n[4] + 0xffffffffffff;
      sStack_690.normalized = 0;
      sStack_690.magnitude = sStack_690.magnitude + 1;
      pcStack_6f8 = (code *)0x14d278;
      secp256k1_fe_verify(&sStack_690);
      pcStack_6f8 = (code *)0x14d280;
      secp256k1_fe_verify(&sStack_690);
      uVar51 = (sStack_690.n[4] >> 0x30) * 0x1000003d1 + sStack_690.n[0];
      uVar52 = (uVar51 >> 0x34) + sStack_690.n[1];
      uVar19 = (uVar52 >> 0x34) + sStack_690.n[2];
      psVar46 = (secp256k1_fe *)((uVar19 >> 0x34) + sStack_690.n[3]);
      uVar50 = ((ulong)psVar46 >> 0x34) + (sStack_690.n[4] & 0xffffffffffff);
      if ((((uVar52 | uVar51 | uVar19 | (ulong)psVar46) & 0xfffffffffffff) != 0 || uVar50 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar50 ^ 0xf000000000000),
         ((uVar51 ^ 0x1000003d0) & uVar52 & uVar19 & (ulong)psVar46 & (ulong)r_00) !=
         0xfffffffffffff)) goto LAB_0014d667;
      sStack_6c0.n[0] = psVar45->n[0];
      sStack_6c0.n[1] = psVar45->n[1];
      sStack_6c0.n[2] = psVar45->n[2];
      sStack_6c0.n[3] = psVar45->n[3];
      sStack_6c0.n[4] = psVar45->n[4];
      sStack_6c0.magnitude = psVar45->magnitude;
      sStack_6c0.normalized = psVar45->normalized;
      psVar45 = &sStack_6c0;
      pcStack_6f8 = (code *)0x14d326;
      secp256k1_fe_verify(psVar45);
      r_00 = &fe_minus_one;
      pcStack_6f8 = (code *)0x14d332;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_6c0.magnitude) goto LAB_0014d66c;
      sStack_6c0.n[0] = sStack_6c0.n[0] + 0xffffefffffc2e;
      sStack_6c0.n[1] = sStack_6c0.n[1] + 0xfffffffffffff;
      sStack_6c0.n[2] = sStack_6c0.n[2] + 0xfffffffffffff;
      sStack_6c0.n[3] = sStack_6c0.n[3] + 0xfffffffffffff;
      sStack_6c0.n[4] = sStack_6c0.n[4] + 0xffffffffffff;
      sStack_6c0.normalized = 0;
      sStack_6c0.magnitude = sStack_6c0.magnitude + 1;
      pcStack_6f8 = (code *)0x14d37d;
      secp256k1_fe_verify(&sStack_6c0);
      pcStack_6f8 = (code *)0x14d385;
      secp256k1_fe_verify(&sStack_6c0);
      uVar51 = (sStack_6c0.n[4] >> 0x30) * 0x1000003d1 + sStack_6c0.n[0];
      if (((uVar51 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar51 & 0xfffffffffffff) == 0)) {
        uVar52 = (uVar51 >> 0x34) + sStack_6c0.n[1];
        uVar19 = (uVar52 >> 0x34) + sStack_6c0.n[2];
        uVar50 = (uVar19 >> 0x34) + sStack_6c0.n[3];
        uVar53 = (uVar50 >> 0x34) + (sStack_6c0.n[4] & 0xffffffffffff);
        if (((uVar52 | uVar51 | uVar19 | uVar50) & 0xfffffffffffff) == 0 && uVar53 == 0) {
          return;
        }
        if (((uVar51 | 0x1000003d0) & uVar52 & uVar19 & uVar50 & (uVar53 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar46 = &sStack_6c0;
      pcStack_6f8 = (code *)0x14d434;
      (*pcVar29)();
      pcStack_6f8 = (code *)0x14d43f;
      secp256k1_fe_verify(&sStack_6f0);
      r_00 = &fe_minus_one;
      pcStack_6f8 = (code *)0x14d44b;
      secp256k1_fe_verify(&fe_minus_one);
      psVar45 = &sStack_6f0;
      if (0x1f < sStack_6f0.magnitude) goto LAB_0014d671;
      sStack_6f0.n[0] = sStack_6f0.n[0] + 0xffffefffffc2e;
      sStack_6f0.n[1] = sStack_6f0.n[1] + 0xfffffffffffff;
      sStack_6f0.n[2] = sStack_6f0.n[2] + 0xfffffffffffff;
      sStack_6f0.n[3] = sStack_6f0.n[3] + 0xfffffffffffff;
      sStack_6f0.n[4] = sStack_6f0.n[4] + 0xffffffffffff;
      sStack_6f0.magnitude = sStack_6f0.magnitude + 1;
      sStack_6f0.normalized = 0;
      pcStack_6f8 = (code *)0x14d494;
      secp256k1_fe_verify(&sStack_6f0);
      pcStack_6f8 = (code *)0x14d49d;
      (*pcVar29)(&sStack_6f0);
      pcStack_6f8 = (code *)0x14d4a5;
      secp256k1_fe_verify(&sStack_6f0);
      sStack_6f0.n[0] = sStack_6f0.n[0] + 1;
      sStack_6f0.magnitude = sStack_6f0.magnitude + 1;
      sStack_6f0.normalized = 0;
      pcStack_6f8 = (code *)0x14d4b7;
      secp256k1_fe_verify(&sStack_6f0);
      pcStack_6f8 = (code *)0x14d4bf;
      secp256k1_fe_verify(&sStack_6f0);
      psVar46 = &sStack_6c0;
      pcStack_6f8 = (code *)0x14d4cc;
      r_00 = psVar46;
      secp256k1_fe_verify(psVar46);
      if (sStack_6c0.magnitude + sStack_6f0.magnitude < 0x21) {
        sStack_6f0.n[0] = sStack_6f0.n[0] + sStack_6c0.n[0];
        sStack_6f0.n[1] = sStack_6f0.n[1] + sStack_6c0.n[1];
        sStack_6f0.n[2] = sStack_6f0.n[2] + sStack_6c0.n[2];
        sStack_6f0.n[3] = sStack_6f0.n[3] + sStack_6c0.n[3];
        sStack_6f0.n[4] = sStack_6f0.n[4] + sStack_6c0.n[4];
        sStack_6f0.normalized = 0;
        pcStack_6f8 = (code *)0x14d518;
        sStack_6f0.magnitude = sStack_6c0.magnitude + sStack_6f0.magnitude;
        secp256k1_fe_verify(&sStack_6f0);
        pcStack_6f8 = (code *)0x14d520;
        secp256k1_fe_verify(&sStack_6f0);
        uVar51 = (sStack_6f0.n[4] >> 0x30) * 0x1000003d1 + sStack_6f0.n[0];
        if (((uVar51 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar51 & 0xfffffffffffff) == 0)) {
          uVar41 = (uVar51 >> 0x34) + sStack_6f0.n[1];
          uVar52 = (uVar41 >> 0x34) + sStack_6f0.n[2];
          uVar19 = (uVar52 >> 0x34) + sStack_6f0.n[3];
          uVar50 = (uVar19 >> 0x34) + (sStack_6f0.n[4] & 0xffffffffffff);
          if (((uVar41 | uVar51 | uVar52 | uVar19) & 0xfffffffffffff) == 0 && uVar50 == 0) {
            return;
          }
          if (((uVar51 | 0x1000003d0) & uVar41 & uVar52 & uVar19 & (uVar50 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_6f8 = (code *)0x14d5c9;
        test_inverse_field_cold_2();
        goto LAB_0014d5c9;
      }
    }
    else {
      pcStack_6f8 = (code *)0x14d667;
      test_inverse_field_cold_7();
LAB_0014d667:
      pcStack_6f8 = (code *)0x14d66c;
      test_inverse_field_cold_6();
LAB_0014d66c:
      pcStack_6f8 = (code *)0x14d671;
      test_inverse_field_cold_5();
LAB_0014d671:
      r = psVar46;
      psVar33 = psVar45;
      psVar46 = &sStack_690;
      pcStack_6f8 = (code *)0x14d676;
      test_inverse_field_cold_4();
    }
    pcStack_6f8 = (code *)0x14d67b;
    test_inverse_field_cold_3();
  }
  pcStack_6f8 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_6f8 = (code *)0xfffffffffffff;
  psVar45 = (secp256k1_fe *)auStack_768;
  pcVar69 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar69 = secp256k1_scalar_inverse;
  }
  pcStack_770 = (code *)0x14d6a9;
  auStack_728._32_8_ = psVar33;
  auStack_728._40_8_ = psVar46;
  (*pcVar69)(auStack_768);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_768._20_4_,auStack_768._16_4_);
    r_00->n[3] = CONCAT44(auStack_768._28_4_,auStack_768._24_4_);
    r_00->n[0] = CONCAT44(auStack_768._4_4_,auStack_768._0_4_);
    r_00->n[1] = CONCAT44(auStack_768._12_4_,auStack_768._8_4_);
  }
  pcStack_770 = (code *)0x14d6c8;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar71._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar71._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar71._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar71._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar14 = movmskps(extraout_EAX,auVar71);
  if (iVar14 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_728;
    pcStack_770 = (code *)0x14d6fc;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_768);
    pcStack_770 = (code *)0x14d704;
    psVar33 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_728._0_8_ != 1 || auStack_728._8_8_ != 0) || auStack_728._16_8_ != 0) ||
        auStack_728._24_8_ != 0) {
      pcStack_770 = (code *)0x14d80e;
      test_inverse_scalar_cold_1();
      goto LAB_0014d80e;
    }
    pcStack_770 = (code *)0x14d734;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_768 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_770 = (code *)0x14d73c;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_768 + 0x20));
    auVar72._0_4_ = -(uint)(iStack_738 == 0 && auStack_768._32_4_ == 0);
    auVar72._4_4_ = -(uint)(iStack_734 == 0 && iStack_744 == 0);
    auVar72._8_4_ = -(uint)(iStack_730 == 0 && iStack_740 == 0);
    auVar72._12_4_ = -(uint)(iStack_72c == 0 && iStack_73c == 0);
    iVar14 = movmskps(extraout_EAX_00,auVar72);
    if (iVar14 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_768 + 0x20);
    pcStack_770 = (code *)0x14d76d;
    (*pcVar69)(a,a);
    pcStack_770 = (code *)0x14d782;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_768,&scalar_minus_one,(secp256k1_scalar *)auStack_768);
    pcStack_770 = (code *)0x14d78b;
    (*pcVar69)(auStack_768,auStack_768);
    pcStack_770 = (code *)0x14d79d;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_768,(secp256k1_scalar *)auStack_768,&secp256k1_scalar_one
              );
    pcStack_770 = (code *)0x14d7ab;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_768,a,(secp256k1_scalar *)auStack_768);
    pcStack_770 = (code *)0x14d7b3;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_768);
    auVar73._0_4_ = -(uint)(auStack_768._16_4_ == 0 && auStack_768._0_4_ == 0);
    auVar73._4_4_ = -(uint)(auStack_768._20_4_ == 0 && auStack_768._4_4_ == 0);
    auVar73._8_4_ = -(uint)(auStack_768._24_4_ == 0 && auStack_768._8_4_ == 0);
    auVar73._12_4_ = -(uint)(auStack_768._28_4_ == 0 && auStack_768._12_4_ == 0);
    iVar14 = movmskps(extraout_EAX_01,auVar73);
    if (iVar14 == 0xf) {
      return;
    }
    pcStack_770 = (code *)0x14d7d7;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_768;
  }
  pcStack_770 = (code *)0x14d7e2;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_768);
  auVar74._0_4_ = -(uint)(auStack_768._16_4_ == 0 && auStack_768._0_4_ == 0);
  auVar74._4_4_ = -(uint)(auStack_768._20_4_ == 0 && auStack_768._4_4_ == 0);
  auVar74._8_4_ = -(uint)(auStack_768._24_4_ == 0 && auStack_768._8_4_ == 0);
  auVar74._12_4_ = -(uint)(auStack_768._28_4_ == 0 && auStack_768._12_4_ == 0);
  iVar14 = movmskps(extraout_EAX_02,auVar74);
  r = (secp256k1_fe *)auStack_768;
  psVar33 = psVar45;
  if (iVar14 == 0xf) {
    return;
  }
LAB_0014d80e:
  pcStack_770 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_788 = 0x1000003d1;
  __s = auStack_1820;
  psStack_798 = r;
  pcStack_790 = pcVar29;
  psStack_780 = r_00;
  pcStack_778 = pcVar69;
  pcStack_770 = (code *)uVar41;
  memset(__s,0,0x1081);
  uStack_1830 = 0;
  lVar18 = 0x41;
  psStack_1828 = psVar33;
  secp256k1_hsort(__s,0x41,(size_t)psVar33,test_hsort_cmp,&uStack_1830);
  if (0x3f < uStack_1830) {
    test_hsort_is_sorted(auStack_1820,0x41,(size_t)psVar33);
    if (0 < COUNT) {
      iVar14 = 0;
      do {
        uVar16 = testrand_int(0x41);
        count = (size_t)(int)uVar16;
        testrand_bytes_test(auStack_1820,count * (long)psVar33);
        secp256k1_hsort(auStack_1820,count,(size_t)psVar33,test_hsort_cmp,&uStack_1830);
        test_hsort_is_sorted(auStack_1820,count,(size_t)psVar33);
        iVar14 = iVar14 + 1;
      } while (iVar14 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar28 = 0;
    do {
      if (__s[lVar28] != *(uchar *)(lVar18 + lVar28)) {
        return;
      }
      lVar28 = lVar28 + 1;
    } while (extraout_RDX_01[1] != lVar28);
  }
  return;
LAB_0014b464:
  pcStack_f0 = (code *)0x14b469;
  test_modinv32_uint16_cold_5();
LAB_0014b469:
  pcStack_f0 = (code *)0x14b46e;
  test_modinv32_uint16_cold_3();
LAB_0014b46e:
  pcStack_f0 = (code *)0x14b473;
  test_modinv32_uint16_cold_1();
  psVar36 = psVar47;
LAB_0014b473:
  psVar68 = psVar36;
  pcStack_f0 = (code *)0x14b478;
  test_modinv32_uint16_cold_6();
  goto LAB_0014b478;
LAB_0014b9cf:
  pcStack_1d8 = (code *)0x14b9d4;
  test_modinv64_uint16_cold_5();
  goto LAB_0014b9d4;
}

Assistant:

static void test_modinv32_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    uint16_t tmp[16];
    secp256k1_modinv32_signed30 x;
    secp256k1_modinv32_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed30(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4] | x.v[5] | x.v[6] | x.v[7] | x.v[8]) != 0;
    uint16_to_signed30(&m.modulus, mod);

    /* compute 1/modulus mod 2^30 */
    m.modulus_inv30 = modinv2p64(m.modulus.v[0]) & 0x3fffffff;
    CHECK(((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1);

    /* Test secp256k1_jacobi32_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed30(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed30(&x, sqr);
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed30(&x, in);
    mutate_sign_signed30(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* produce output */
        signed30_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* check if the result is equal to the input */
        signed30_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}